

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::BNLL_x86_fma::forward_inplace(BNLL_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  long *in_RSI;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar98;
  float fVar99;
  undefined1 auVar95 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar103 [16];
  __m128 _x_1;
  __m128 _tmp_1;
  __m128 _abs_p_1;
  __m128 mask_3;
  __m128 _p_1;
  __m128 _zero;
  __m128 _one;
  __m256 _x;
  __m256 _tmp;
  __m256 _abs_p;
  __m256 mask;
  __m256 _p;
  __m256 _zero_avx;
  __m256 _one_avx;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m256 y_1;
  __m256 z;
  __m256 tmp_1;
  __m256 mask_2;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_1;
  __m256i imm0_1;
  __m256 pow2n;
  __m256 y;
  __m256 mask_1;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  v4sf y_3;
  v4sf z_1;
  v4sf tmp_3;
  v4sf mask_5;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_3;
  v4si emm0_1;
  v4sf pow2n_1;
  v4sf y_2;
  v4sf mask_4;
  v4sf one_2;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_2;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  imm_xmm_union u_7;
  __m256i ret_3;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  undefined8 local_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 local_26b0;
  undefined8 uStack_26a8;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined4 uStack_25f4;
  undefined4 uStack_25f0;
  undefined4 uStack_25ec;
  undefined4 uStack_25e8;
  undefined4 uStack_25e4;
  int local_2598;
  undefined8 local_2588;
  undefined8 local_2580;
  undefined8 local_2578;
  undefined4 local_2570;
  long local_2568;
  undefined4 local_2560;
  undefined4 local_255c;
  undefined4 local_2558;
  undefined4 local_2554;
  undefined4 local_2550;
  undefined8 local_2548;
  undefined1 (*local_2540) [32];
  int local_2534;
  int local_2530;
  int local_252c;
  int local_2528;
  int local_2524;
  int local_2520;
  int local_251c;
  long *local_2510;
  undefined1 local_24fd;
  int local_24fc;
  undefined8 *local_24f0;
  undefined8 *local_24e8;
  undefined8 *local_24d8;
  undefined4 local_24c4;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 (*local_2468) [32];
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  int local_2420 [2];
  int aiStack_2418 [2];
  int aiStack_2410 [2];
  int aiStack_2408 [2];
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined1 local_23e0 [8];
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  ulong uStack_23c8;
  float local_23c0;
  float fStack_23bc;
  float fStack_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  undefined1 local_23a0 [32];
  undefined1 local_2380 [32];
  undefined1 local_2360 [8];
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined1 local_2340 [32];
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined1 local_22e0 [8];
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined1 local_22c0 [32];
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined1 local_2080 [8];
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined1 local_2060 [32];
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined1 local_2000 [32];
  undefined1 local_1fe0 [8];
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined1 local_1fc0 [32];
  undefined1 local_1fa0 [32];
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined1 local_1ec0 [32];
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  ulong uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined1 (*local_1dc8) [32];
  undefined4 local_1dc0;
  undefined4 uStack_1dbc;
  undefined4 uStack_1db8;
  undefined4 uStack_1db4;
  undefined4 local_1da4;
  undefined1 local_1da0 [16];
  undefined1 (*local_1d88) [32];
  undefined8 local_1d80;
  ulong uStack_1d78;
  undefined8 local_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 local_1d50;
  undefined8 uStack_1d48;
  int local_1d40 [2];
  int aiStack_1d38 [2];
  undefined8 local_1d30;
  undefined8 uStack_1d28;
  undefined1 local_1d20 [8];
  undefined8 uStack_1d18;
  float local_1d10;
  float fStack_1d0c;
  float fStack_1d08;
  float fStack_1d04;
  undefined1 local_1d00 [16];
  undefined1 local_1cf0 [16];
  undefined1 local_1ce0 [8];
  undefined8 uStack_1cd8;
  undefined1 local_1cd0 [16];
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined1 local_1cb0 [16];
  undefined1 local_1ca0 [8];
  undefined8 uStack_1c98;
  undefined8 local_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 local_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 local_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 local_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 local_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 local_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 local_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 local_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 local_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined1 local_1b70 [8];
  undefined8 uStack_1b68;
  undefined1 local_1b60 [16];
  undefined8 local_1b50;
  undefined8 uStack_1b48;
  undefined1 local_1b40 [16];
  undefined1 local_1b30 [8];
  undefined8 uStack_1b28;
  undefined1 local_1b20 [8];
  undefined8 uStack_1b18;
  undefined1 local_1b10 [16];
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 local_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 local_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 local_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 local_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 local_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined1 local_1a50 [16];
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 local_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 local_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  ulong uStack_19f8;
  undefined8 local_19f0;
  undefined8 uStack_19e8;
  undefined1 (*local_19d8) [32];
  long local_19d0;
  undefined4 local_19c4;
  long local_19c0;
  undefined1 (*local_19b8) [32];
  undefined4 local_19ac;
  int local_19a8;
  int local_19a4;
  undefined8 *local_19a0;
  undefined4 local_1994;
  long local_1990;
  undefined8 *local_1970;
  undefined1 local_1940 [16];
  undefined1 auStack_1930 [16];
  undefined4 local_1920;
  undefined4 local_191c;
  undefined4 local_1918;
  undefined4 local_1914;
  undefined4 local_1910;
  undefined4 local_190c;
  undefined4 local_1908;
  undefined4 local_1904;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined1 local_1810 [16];
  undefined1 local_1800 [16];
  undefined4 local_17e4;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 local_1690;
  undefined8 uStack_1688;
  undefined1 local_1680 [16];
  undefined1 local_1670 [16];
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  ulong uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined1 *local_14b8;
  undefined1 *local_14b0;
  undefined1 *local_14a8;
  float *local_14a0;
  undefined1 *local_1498;
  undefined1 *local_1490;
  float *local_1488;
  undefined1 *local_1480;
  undefined1 *local_1478;
  float *local_1470;
  undefined1 *local_1468;
  undefined1 *local_1460;
  float *local_1458;
  undefined1 *local_1450;
  undefined1 *local_1448;
  float *local_1440;
  undefined1 *local_1438;
  undefined1 *local_1430;
  float *local_1428;
  float *local_1420;
  undefined1 *local_1418;
  undefined1 *local_1410;
  float *local_1408;
  undefined1 *local_1400;
  undefined1 *local_13f8;
  float *local_13f0;
  undefined1 *local_13e8;
  float *local_13e0;
  undefined1 *local_13d8;
  undefined1 *local_13d0;
  float *local_13c8;
  undefined1 *local_13c0;
  undefined1 *local_13b8;
  float *local_13b0;
  undefined1 *local_13a8;
  undefined1 *local_13a0;
  float *local_1398;
  undefined1 *local_1390;
  undefined1 *local_1388;
  float *local_1380;
  undefined1 *local_1378;
  undefined1 *local_1370;
  float *local_1368;
  undefined1 *local_1360;
  undefined1 *local_1358;
  float *local_1350;
  undefined1 *local_1348;
  undefined1 *local_1340;
  float *local_1338;
  undefined1 *local_1330;
  undefined1 *local_1328;
  undefined1 *local_1320;
  float *local_1318;
  undefined1 *local_1310;
  undefined1 *local_1308;
  float *local_1300;
  undefined1 *local_12f8;
  undefined1 *local_12f0;
  float *local_12e8;
  float *local_12e0;
  undefined4 local_12d4;
  undefined8 local_12d0;
  undefined8 uStack_12c8;
  undefined4 local_12b4;
  undefined8 local_12b0;
  undefined8 uStack_12a8;
  undefined4 local_1294;
  undefined8 local_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 local_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 local_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 local_1230;
  undefined8 uStack_1228;
  float local_1220 [2];
  float afStack_1218 [2];
  float afStack_1210 [2];
  float afStack_1208 [2];
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  float local_11c0 [2];
  float afStack_11b8 [2];
  float afStack_11b0 [2];
  float afStack_11a8 [2];
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  float local_1160 [2];
  float afStack_1158 [2];
  float afStack_1150 [2];
  float afStack_1148 [2];
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  float local_1100 [2];
  float afStack_10f8 [2];
  float afStack_10f0 [2];
  float afStack_10e8 [2];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  float local_10a0 [2];
  float afStack_1098 [2];
  float afStack_1090 [2];
  float afStack_1088 [2];
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  float local_1040 [2];
  float afStack_1038 [2];
  float afStack_1030 [2];
  float afStack_1028 [2];
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  float local_fe0 [2];
  float afStack_fd8 [2];
  float afStack_fd0 [2];
  float afStack_fc8 [2];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  float local_f80 [2];
  float afStack_f78 [2];
  float afStack_f70 [2];
  float afStack_f68 [2];
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  ulong uStack_f08;
  float local_f00 [2];
  float afStack_ef8 [2];
  float afStack_ef0 [2];
  float afStack_ee8 [2];
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  float local_ea0 [2];
  float afStack_e98 [2];
  float afStack_e90 [2];
  float afStack_e88 [2];
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  float local_e60 [2];
  float afStack_e58 [2];
  float afStack_e50 [2];
  float afStack_e48 [2];
  float local_e40 [2];
  float afStack_e38 [2];
  float afStack_e30 [2];
  float afStack_e28 [2];
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  float local_e00 [2];
  float afStack_df8 [2];
  float afStack_df0 [2];
  float afStack_de8 [2];
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  float local_da0 [2];
  float afStack_d98 [2];
  float afStack_d90 [2];
  float afStack_d88 [2];
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  float local_d40 [2];
  float afStack_d38 [2];
  float afStack_d30 [2];
  float afStack_d28 [2];
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  float local_ce0 [2];
  float afStack_cd8 [2];
  float afStack_cd0 [2];
  float afStack_cc8 [2];
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  float local_c80 [2];
  float afStack_c78 [2];
  float afStack_c70 [2];
  float afStack_c68 [2];
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  float local_ba0 [2];
  float afStack_b98 [2];
  float afStack_b90 [2];
  float afStack_b88 [2];
  ulong local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  float local_b40 [2];
  float afStack_b38 [2];
  float afStack_b30 [2];
  float afStack_b28 [2];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float local_ae0 [2];
  float afStack_ad8 [2];
  float afStack_ad0 [2];
  float afStack_ac8 [2];
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [16];
  undefined4 local_8a4;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined4 local_7e4;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined4 local_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined4 local_7a4;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  float *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  float *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  float *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  float *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  float *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  float *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  float *local_528;
  undefined1 *local_520;
  float *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  float *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  float *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  float *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  float *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  float *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  float *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  float *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  float *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  float *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  float *local_420;
  float *local_418;
  float local_410 [2];
  float afStack_408 [2];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  float local_3e0 [2];
  float afStack_3d8 [2];
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  float local_3b0 [2];
  float afStack_3a8 [2];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  float local_380 [2];
  float afStack_378 [2];
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_350 [2];
  float afStack_348 [2];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_320 [2];
  float afStack_318 [2];
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  float local_2f0 [2];
  float afStack_2e8 [2];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  float local_2c0 [2];
  float afStack_2b8 [2];
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  float local_280 [2];
  float afStack_278 [2];
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  float local_250 [2];
  float afStack_248 [2];
  undefined8 local_240;
  undefined8 uStack_238;
  float local_230 [2];
  float afStack_228 [2];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  float local_200 [2];
  float afStack_1f8 [2];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1d0 [2];
  float afStack_1c8 [2];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  float local_1a0 [2];
  float afStack_198 [2];
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  float local_170 [2];
  float afStack_168 [2];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  float local_100 [2];
  float afStack_f8 [2];
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  float local_d0 [2];
  float afStack_c8 [2];
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  float local_a0 [2];
  float afStack_98 [2];
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined1 auVar96 [24];
  undefined1 auVar97 [32];
  
  local_251c = *(int *)((long)in_RSI + 0x2c);
  local_2520 = (int)in_RSI[6];
  local_2524 = *(int *)((long)in_RSI + 0x34);
  local_2528 = (int)in_RSI[7];
  local_252c = (int)in_RSI[3];
  local_2530 = local_251c * local_2520 * local_2524 * local_252c;
  local_2510 = in_RSI;
  for (local_2534 = 0; local_2534 < local_2528; local_2534 = local_2534 + 1) {
    local_24f0 = &local_2588;
    local_19a4 = *(int *)((long)local_2510 + 0x2c);
    local_19a8 = (int)local_2510[6];
    local_19ac = *(undefined4 *)((long)local_2510 + 0x34);
    local_19b8 = (undefined1 (*) [32])
                 (*local_2510 + local_2510[8] * (long)local_2534 * local_2510[2]);
    local_19c0 = local_2510[2];
    local_19c4 = (undefined4)local_2510[3];
    local_19d0 = local_2510[4];
    local_19a0 = &local_2588;
    local_1990 = (long)local_19a4 * (long)local_19a8 * local_19c0;
    local_24e8 = &local_2588;
    local_24d8 = &local_2588;
    local_1994 = 0x10;
    local_24fc = local_2534;
    local_24fd = 1;
    local_2588 = 0;
    local_2578 = 0;
    local_2570 = 0;
    local_2560 = 0;
    local_255c = 0;
    local_2558 = 0;
    local_2554 = 0;
    local_2550 = 0;
    local_2548 = 0;
    local_2580 = 0;
    local_2598 = 0;
    local_24c4 = 0x3f800000;
    local_1904 = 0x3f800000;
    local_1908 = 0x3f800000;
    local_190c = 0x3f800000;
    local_1910 = 0x3f800000;
    local_1914 = 0x3f800000;
    local_1918 = 0x3f800000;
    local_191c = 0x3f800000;
    local_1920 = 0x3f800000;
    auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
    local_1940 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
    auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
    auStack_1930 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
    local_24a0._8_8_ = SUB328(ZEXT832(0),4);
    local_2540 = local_19b8;
    for (; local_2598 + 7 < local_2530; local_2598 = local_2598 + 8) {
      local_2468 = local_2540;
      local_2440 = *(undefined8 *)*local_2540;
      uStack_2438 = *(undefined8 *)(*local_2540 + 8);
      uStack_2430 = *(undefined8 *)(*local_2540 + 0x10);
      uStack_2428 = *(undefined8 *)(*local_2540 + 0x18);
      uStack_25f4 = (undefined4)((ulong)uStack_2438 >> 0x20);
      uStack_25f0 = (undefined4)uStack_2430;
      uStack_25ec = (undefined4)((ulong)uStack_2430 >> 0x20);
      uStack_25e8 = (undefined4)uStack_2428;
      uStack_25e4 = (undefined4)((ulong)uStack_2428 >> 0x20);
      auVar1._12_4_ = uStack_25f4;
      auVar1._0_12_ = *(undefined1 (*) [12])*local_2540;
      auVar1._16_4_ = uStack_25f0;
      auVar1._20_4_ = uStack_25ec;
      auVar1._24_4_ = uStack_25e8;
      auVar1._28_4_ = uStack_25e4;
      local_24c0 = ZEXT1632(ZEXT816(0) << 0x40);
      auVar2 = vcmpps_avx(local_24c0,auVar1,1);
      local_2420[0] = 0x7fffffff;
      local_2420[1] = 0x7fffffff;
      aiStack_2418[0] = 0x7fffffff;
      aiStack_2418[1] = 0x7fffffff;
      aiStack_2410[0] = 0x7fffffff;
      aiStack_2410[1] = 0x7fffffff;
      aiStack_2408[0] = 0x7fffffff;
      aiStack_2408[1] = 0x7fffffff;
      auVar6._8_4_ = 0x7fffffff;
      auVar6._12_4_ = 0x7fffffff;
      auVar6._0_4_ = 0x7fffffff;
      auVar6._4_4_ = 0x7fffffff;
      auVar6._16_4_ = 0x7fffffff;
      auVar6._20_4_ = 0x7fffffff;
      auVar6._24_4_ = 0x7fffffff;
      auVar6._28_4_ = 0x7fffffff;
      auVar1 = vandps_avx(*local_2540,auVar6);
      local_1e20 = 0;
      uStack_1e18 = local_24a0._8_8_;
      uStack_1e10 = 0;
      uStack_1e08 = 0;
      local_2640 = auVar1._0_8_;
      local_1e40 = local_2640;
      uStack_2638 = auVar1._8_8_;
      uStack_1e38 = uStack_2638;
      uStack_2630 = auVar1._16_8_;
      uStack_1e30 = uStack_2630;
      uStack_2628 = auVar1._24_8_;
      uStack_1e28 = uStack_2628;
      auVar1 = vsubps_avx(ZEXT832((ulong)local_24a0._8_8_) << 0x40,auVar1);
      local_2320 = 0x3f8000003f800000;
      uStack_2318 = 0x3f8000003f800000;
      uStack_2310 = 0x3f8000003f800000;
      uStack_2308 = 0x3f8000003f800000;
      local_1fc0._0_8_ = auVar1._0_8_;
      local_a80 = local_1fc0._0_8_;
      local_1fc0._8_8_ = auVar1._8_8_;
      uStack_a78 = local_1fc0._8_8_;
      local_1fc0._16_8_ = auVar1._16_8_;
      uStack_a70 = local_1fc0._16_8_;
      local_1fc0._24_8_ = auVar1._24_8_;
      uStack_a68 = local_1fc0._24_8_;
      local_aa0 = 0x42b0c0a542b0c0a5;
      uStack_a98 = 0x42b0c0a542b0c0a5;
      uStack_a90 = 0x42b0c0a542b0c0a5;
      uStack_a88 = 0x42b0c0a542b0c0a5;
      auVar59._8_8_ = 0x42b0c0a542b0c0a5;
      auVar59._0_8_ = 0x42b0c0a542b0c0a5;
      auVar59._16_8_ = 0x42b0c0a542b0c0a5;
      auVar59._24_8_ = 0x42b0c0a542b0c0a5;
      auVar1 = vminps_avx(auVar1,auVar59);
      local_1fc0._0_8_ = auVar1._0_8_;
      local_18e0 = local_1fc0._0_8_;
      local_1fc0._8_8_ = auVar1._8_8_;
      uStack_18d8 = local_1fc0._8_8_;
      local_1fc0._16_8_ = auVar1._16_8_;
      uStack_18d0 = local_1fc0._16_8_;
      local_1fc0._24_8_ = auVar1._24_8_;
      uStack_18c8 = local_1fc0._24_8_;
      local_1900 = 0xc2b0c0a5c2b0c0a5;
      uStack_18f8 = 0xc2b0c0a5c2b0c0a5;
      uStack_18f0 = 0xc2b0c0a5c2b0c0a5;
      uStack_18e8 = 0xc2b0c0a5c2b0c0a5;
      auVar34._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar34._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar34._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar34._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6 = vmaxps_avx(auVar1,auVar34);
      local_14b8 = local_1fc0;
      local_1420 = ::_ps256_cephes_LOG2EF;
      local_1428 = ::_ps256_0p5;
      local_1fc0._0_8_ = auVar6._0_8_;
      local_e20 = local_1fc0._0_8_;
      local_1fc0._8_8_ = auVar6._8_8_;
      uStack_e18 = local_1fc0._8_8_;
      local_1fc0._16_8_ = auVar6._16_8_;
      uStack_e10 = local_1fc0._16_8_;
      local_1fc0._24_8_ = auVar6._24_8_;
      uStack_e08 = local_1fc0._24_8_;
      local_e40[0] = 1.442695;
      local_e40[1] = 1.442695;
      afStack_e38[0] = 1.442695;
      afStack_e38[1] = 1.442695;
      afStack_e30[0] = 1.442695;
      afStack_e30[1] = 1.442695;
      afStack_e28[0] = 1.442695;
      afStack_e28[1] = 1.442695;
      local_e60[0] = 0.5;
      local_e60[1] = 0.5;
      afStack_e58[0] = 0.5;
      afStack_e58[1] = 0.5;
      afStack_e50[0] = 0.5;
      afStack_e50[1] = 0.5;
      afStack_e48[0] = 0.5;
      afStack_e48[1] = 0.5;
      auVar50._8_4_ = 1.442695;
      auVar50._12_4_ = 1.442695;
      auVar50._0_4_ = 1.442695;
      auVar50._4_4_ = 1.442695;
      auVar50._16_4_ = 1.442695;
      auVar50._20_4_ = 1.442695;
      auVar50._24_4_ = 1.442695;
      auVar50._28_4_ = 1.442695;
      auVar93._8_4_ = 0.5;
      auVar93._12_4_ = 0.5;
      auVar93._0_4_ = 0.5;
      auVar93._4_4_ = 0.5;
      auVar93._16_4_ = 0.5;
      auVar93._20_4_ = 0.5;
      auVar93._24_4_ = 0.5;
      auVar93._28_4_ = 0.5;
      auVar4 = vfmadd213ps_fma(auVar50,auVar6,auVar93);
      auVar8 = vroundps_avx(ZEXT1632(auVar4),1);
      auVar1 = vcmpps_avx(ZEXT1632(auVar4),auVar8,1);
      local_2060._0_8_ = auVar1._0_8_;
      local_1f60 = local_2060._0_8_;
      local_2060._8_8_ = auVar1._8_8_;
      uStack_1f58 = local_2060._8_8_;
      local_2060._16_8_ = auVar1._16_8_;
      uStack_1f50 = local_2060._16_8_;
      local_2060._24_8_ = auVar1._24_8_;
      uStack_1f48 = local_2060._24_8_;
      local_1f80 = 0x3f8000003f800000;
      uStack_1f78 = 0x3f8000003f800000;
      uStack_1f70 = 0x3f8000003f800000;
      uStack_1f68 = 0x3f8000003f800000;
      auVar24._8_8_ = 0x3f8000003f800000;
      auVar24._0_8_ = 0x3f8000003f800000;
      auVar24._16_8_ = 0x3f8000003f800000;
      auVar24._24_8_ = 0x3f8000003f800000;
      local_2060 = vandps_avx(auVar1,auVar24);
      local_1fe0 = auVar8._0_8_;
      local_1ee0 = local_1fe0;
      uStack_1fd8 = auVar8._8_8_;
      uStack_1ed8 = uStack_1fd8;
      uStack_1fd0 = auVar8._16_8_;
      uStack_1ed0 = uStack_1fd0;
      uStack_1fc8 = auVar8._24_8_;
      uStack_1ec8 = uStack_1fc8;
      local_1f00 = local_2060._0_8_;
      uStack_1ef8 = local_2060._8_8_;
      uStack_1ef0 = local_2060._16_8_;
      uStack_1ee8 = local_2060._24_8_;
      local_2000 = vsubps_avx(auVar8,local_2060);
      local_1310 = local_2000;
      local_1300 = ::_ps256_cephes_exp_C1;
      local_b20 = local_2000._0_8_;
      uStack_b18 = local_2000._8_8_;
      uStack_b10 = local_2000._16_8_;
      uStack_b08 = local_2000._24_8_;
      local_b40[0] = 0.6933594;
      local_b40[1] = 0.6933594;
      afStack_b38[0] = 0.6933594;
      afStack_b38[1] = 0.6933594;
      afStack_b30[0] = 0.6933594;
      afStack_b30[1] = 0.6933594;
      afStack_b28[0] = 0.6933594;
      afStack_b28[1] = 0.6933594;
      local_b60 = local_1fc0._0_8_;
      uStack_b58 = local_1fc0._8_8_;
      uStack_b50 = local_1fc0._16_8_;
      uStack_b48 = local_1fc0._24_8_;
      auVar57._8_4_ = 0.6933594;
      auVar57._12_4_ = 0.6933594;
      auVar57._0_4_ = 0.6933594;
      auVar57._4_4_ = 0.6933594;
      auVar57._16_4_ = 0.6933594;
      auVar57._20_4_ = 0.6933594;
      auVar57._24_4_ = 0.6933594;
      auVar57._28_4_ = 0.6933594;
      auVar4 = vfnmadd213ps_fma(auVar57,local_2000,auVar6);
      local_1318 = ::_ps256_cephes_exp_C2;
      local_ac0 = local_2000._0_8_;
      uStack_ab8 = local_2000._8_8_;
      uStack_ab0 = local_2000._16_8_;
      uStack_aa8 = local_2000._24_8_;
      local_ae0[0] = -0.00021219444;
      local_ae0[1] = -0.00021219444;
      afStack_ad8[0] = -0.00021219444;
      afStack_ad8[1] = -0.00021219444;
      afStack_ad0[0] = -0.00021219444;
      afStack_ad0[1] = -0.00021219444;
      afStack_ac8[0] = -0.00021219444;
      afStack_ac8[1] = -0.00021219444;
      local_1fc0._0_8_ = auVar4._0_8_;
      local_b00 = local_1fc0._0_8_;
      local_1fc0._8_8_ = auVar4._8_8_;
      uStack_af8 = local_1fc0._8_8_;
      uStack_af0 = 0;
      uStack_ae8 = 0;
      auVar58._8_4_ = -0.00021219444;
      auVar58._12_4_ = -0.00021219444;
      auVar58._0_4_ = -0.00021219444;
      auVar58._4_4_ = -0.00021219444;
      auVar58._16_4_ = -0.00021219444;
      auVar58._20_4_ = -0.00021219444;
      auVar58._24_4_ = -0.00021219444;
      auVar58._28_4_ = -0.00021219444;
      auVar4 = vfnmadd213ps_fma(auVar58,local_2000,ZEXT1632(auVar4));
      auVar93 = ZEXT1632(auVar4);
      local_1fc0._0_8_ = auVar4._0_8_;
      local_15c0 = local_1fc0._0_8_;
      local_1fc0._8_8_ = auVar4._8_8_;
      uStack_15b8 = local_1fc0._8_8_;
      uStack_15b0 = 0;
      uStack_15a8 = 0;
      local_15a0._0_4_ = auVar4._0_4_;
      local_15a0._4_4_ = auVar4._4_4_;
      uStack_1598._0_4_ = auVar4._8_4_;
      uStack_1598._4_4_ = auVar4._12_4_;
      local_1fe0._4_4_ = local_15a0._4_4_ * local_15a0._4_4_;
      local_1fe0._0_4_ = (float)local_15a0 * (float)local_15a0;
      local_c00 = local_1fe0;
      uStack_1fd8._0_4_ = (float)uStack_1598 * (float)uStack_1598;
      uStack_1fd8._4_4_ = uStack_1598._4_4_ * uStack_1598._4_4_;
      auVar7 = _local_1fe0;
      _local_1fe0 = ZEXT1632(_local_1fe0);
      auVar34 = _local_1fe0;
      uStack_2078 = 0x3950696739506967;
      local_2080 = (undefined1  [8])0x3950696739506967;
      uStack_2070 = 0x3950696739506967;
      uStack_2068 = 0x3950696739506967;
      local_14a8 = local_2080;
      local_1440 = ::_ps256_cephes_exp_p1;
      local_dc0 = 0x3950696739506967;
      uStack_db8 = 0x3950696739506967;
      uStack_db0 = 0x3950696739506967;
      uStack_da8 = 0x3950696739506967;
      local_de0 = local_1fc0._0_8_;
      uStack_dd8 = local_1fc0._8_8_;
      uStack_dd0 = 0;
      uStack_dc8 = 0;
      local_e00[0] = 0.0013981999;
      local_e00[1] = 0.0013981999;
      afStack_df8[0] = 0.0013981999;
      afStack_df8[1] = 0.0013981999;
      afStack_df0[0] = 0.0013981999;
      afStack_df0[1] = 0.0013981999;
      afStack_de8[0] = 0.0013981999;
      afStack_de8[1] = 0.0013981999;
      auVar51._8_4_ = 0.0013981999;
      auVar51._12_4_ = 0.0013981999;
      auVar51._0_4_ = 0.0013981999;
      auVar51._4_4_ = 0.0013981999;
      auVar51._16_4_ = 0.0013981999;
      auVar51._20_4_ = 0.0013981999;
      auVar51._24_4_ = 0.0013981999;
      auVar51._28_4_ = 0.0013981999;
      auVar4 = vfmadd213ps_fma(auVar93,_local_2080,auVar51);
      local_1458 = ::_ps256_cephes_exp_p2;
      local_2080 = auVar4._0_8_;
      local_d60 = local_2080;
      uStack_2078 = auVar4._8_8_;
      uStack_d58 = uStack_2078;
      uStack_d50 = 0;
      uStack_d48 = 0;
      local_d80 = local_1fc0._0_8_;
      uStack_d78 = local_1fc0._8_8_;
      uStack_d70 = 0;
      uStack_d68 = 0;
      local_da0[0] = 0.008333452;
      local_da0[1] = 0.008333452;
      afStack_d98[0] = 0.008333452;
      afStack_d98[1] = 0.008333452;
      afStack_d90[0] = 0.008333452;
      afStack_d90[1] = 0.008333452;
      afStack_d88[0] = 0.008333452;
      afStack_d88[1] = 0.008333452;
      auVar52._8_4_ = 0.008333452;
      auVar52._12_4_ = 0.008333452;
      auVar52._0_4_ = 0.008333452;
      auVar52._4_4_ = 0.008333452;
      auVar52._16_4_ = 0.008333452;
      auVar52._20_4_ = 0.008333452;
      auVar52._24_4_ = 0.008333452;
      auVar52._28_4_ = 0.008333452;
      auVar4 = vfmadd213ps_fma(auVar93,ZEXT1632(auVar4),auVar52);
      local_1470 = ::_ps256_cephes_exp_p3;
      local_2080 = auVar4._0_8_;
      local_d00 = local_2080;
      uStack_2078 = auVar4._8_8_;
      uStack_cf8 = uStack_2078;
      uStack_cf0 = 0;
      uStack_ce8 = 0;
      local_d20 = local_1fc0._0_8_;
      uStack_d18 = local_1fc0._8_8_;
      uStack_d10 = 0;
      uStack_d08 = 0;
      local_d40[0] = 0.041665796;
      local_d40[1] = 0.041665796;
      afStack_d38[0] = 0.041665796;
      afStack_d38[1] = 0.041665796;
      afStack_d30[0] = 0.041665796;
      afStack_d30[1] = 0.041665796;
      afStack_d28[0] = 0.041665796;
      afStack_d28[1] = 0.041665796;
      auVar53._8_4_ = 0.041665796;
      auVar53._12_4_ = 0.041665796;
      auVar53._0_4_ = 0.041665796;
      auVar53._4_4_ = 0.041665796;
      auVar53._16_4_ = 0.041665796;
      auVar53._20_4_ = 0.041665796;
      auVar53._24_4_ = 0.041665796;
      auVar53._28_4_ = 0.041665796;
      auVar4 = vfmadd213ps_fma(auVar93,ZEXT1632(auVar4),auVar53);
      local_1488 = ::_ps256_cephes_exp_p4;
      local_2080 = auVar4._0_8_;
      local_ca0 = local_2080;
      uStack_2078 = auVar4._8_8_;
      uStack_c98 = uStack_2078;
      uStack_c90 = 0;
      uStack_c88 = 0;
      local_cc0 = local_1fc0._0_8_;
      uStack_cb8 = local_1fc0._8_8_;
      uStack_cb0 = 0;
      uStack_ca8 = 0;
      local_ce0[0] = 0.16666666;
      local_ce0[1] = 0.16666666;
      afStack_cd8[0] = 0.16666666;
      afStack_cd8[1] = 0.16666666;
      afStack_cd0[0] = 0.16666666;
      afStack_cd0[1] = 0.16666666;
      afStack_cc8[0] = 0.16666666;
      afStack_cc8[1] = 0.16666666;
      auVar54._8_4_ = 0.16666666;
      auVar54._12_4_ = 0.16666666;
      auVar54._0_4_ = 0.16666666;
      auVar54._4_4_ = 0.16666666;
      auVar54._16_4_ = 0.16666666;
      auVar54._20_4_ = 0.16666666;
      auVar54._24_4_ = 0.16666666;
      auVar54._28_4_ = 0.16666666;
      auVar4 = vfmadd213ps_fma(auVar93,ZEXT1632(auVar4),auVar54);
      local_14a0 = ::_ps256_cephes_exp_p5;
      local_2080 = auVar4._0_8_;
      local_c40 = local_2080;
      uStack_2078 = auVar4._8_8_;
      uStack_c38 = uStack_2078;
      uStack_c30 = 0;
      uStack_c28 = 0;
      local_c60 = local_1fc0._0_8_;
      uStack_c58 = local_1fc0._8_8_;
      uStack_c50 = 0;
      uStack_c48 = 0;
      local_c80[0] = 0.5;
      local_c80[1] = 0.5;
      afStack_c78[0] = 0.5;
      afStack_c78[1] = 0.5;
      afStack_c70[0] = 0.5;
      afStack_c70[1] = 0.5;
      afStack_c68[0] = 0.5;
      afStack_c68[1] = 0.5;
      auVar55._8_4_ = 0.5;
      auVar55._12_4_ = 0.5;
      auVar55._0_4_ = 0.5;
      auVar55._4_4_ = 0.5;
      auVar55._16_4_ = 0.5;
      auVar55._20_4_ = 0.5;
      auVar55._24_4_ = 0.5;
      auVar55._28_4_ = 0.5;
      auVar4 = vfmadd213ps_fma(auVar93,ZEXT1632(auVar4),auVar55);
      local_14b0 = local_1fe0;
      local_2080 = auVar4._0_8_;
      local_be0 = local_2080;
      uStack_2078 = auVar4._8_8_;
      uStack_bd8 = uStack_2078;
      uStack_bd0 = 0;
      uStack_bc8 = 0;
      uStack_1fd8 = auVar7._8_8_;
      uStack_bf8 = uStack_1fd8;
      uStack_bf0 = 0;
      uStack_be8 = 0;
      local_c20 = local_1fc0._0_8_;
      uStack_c18 = local_1fc0._8_8_;
      uStack_c10 = 0;
      uStack_c08 = 0;
      auVar4 = vfmadd213ps_fma(auVar34,ZEXT1632(auVar4),auVar93);
      local_2080 = auVar4._0_8_;
      uVar9 = local_2080;
      uStack_2078 = auVar4._8_8_;
      uVar10 = uStack_2078;
      uStack_1f10 = 0;
      uStack_1f08 = 0;
      local_1f40 = 0x3f8000003f800000;
      uStack_1f38 = 0x3f8000003f800000;
      uStack_1f30 = 0x3f8000003f800000;
      uStack_1f28 = 0x3f8000003f800000;
      local_1f20._0_4_ = auVar4._0_4_;
      local_1f20._4_4_ = auVar4._4_4_;
      uStack_1f18._0_4_ = auVar4._8_4_;
      uStack_1f18._4_4_ = auVar4._12_4_;
      local_2080._4_4_ = local_1f20._4_4_ + 1.0;
      local_2080._0_4_ = (float)local_1f20 + 1.0;
      uStack_2078._0_4_ = (float)uStack_1f18 + 1.0;
      uStack_2078._4_4_ = uStack_1f18._4_4_ + 1.0;
      uStack_2070._0_4_ = 0x3f800000;
      uStack_2070._4_4_ = 0x3f800000;
      auVar96 = _local_2080;
      uStack_2068._0_4_ = 0x3f800000;
      uStack_2068._4_4_ = 0x3f800000;
      auVar1 = _local_2080;
      local_a60._0_4_ = local_2000._0_4_;
      local_a60._4_4_ = local_2000._4_4_;
      uStack_a58._0_4_ = local_2000._8_4_;
      uStack_a58._4_4_ = local_2000._12_4_;
      uStack_a50._0_4_ = local_2000._16_4_;
      uStack_a50._4_4_ = local_2000._20_4_;
      uStack_a48._0_4_ = local_2000._24_4_;
      uStack_a48._4_4_ = local_2000._28_4_;
      local_2020 = CONCAT44((int)local_a60._4_4_,(int)(float)local_a60);
      uStack_2018 = CONCAT44((int)uStack_a58._4_4_,(int)(float)uStack_a58);
      uStack_2010 = CONCAT44((int)uStack_a50._4_4_,(int)(float)uStack_a50);
      uStack_2008 = CONCAT44((int)uStack_a48._4_4_,(int)(float)uStack_a48);
      local_960 = local_2020;
      uStack_958 = uStack_2018;
      uStack_950 = uStack_2010;
      uStack_948 = uStack_2008;
      local_1660 = 0x7f0000007f;
      uStack_1658 = 0x7f0000007f;
      uStack_1650 = 0x7f0000007f;
      uStack_1648 = 0x7f0000007f;
      local_a00 = local_2020;
      uStack_9f8 = uStack_2018;
      uStack_9f0 = uStack_2010;
      uStack_9e8 = uStack_2008;
      local_a20 = 0x7f0000007f;
      uStack_a18 = 0x7f0000007f;
      uStack_a10 = 0x7f0000007f;
      uStack_a08 = 0x7f0000007f;
      local_9b0 = 0x7f0000007f;
      uStack_9a8 = 0x7f0000007f;
      local_9c0 = 0x7f0000007f;
      uStack_9b8 = 0x7f0000007f;
      local_820 = local_2020;
      uStack_818 = uStack_2018;
      local_830 = 0x7f0000007f;
      uStack_828 = 0x7f0000007f;
      auVar61._8_8_ = uStack_2018;
      auVar61._0_8_ = local_2020;
      auVar60._8_8_ = 0x7f0000007f;
      auVar60._0_8_ = 0x7f0000007f;
      local_990 = vpaddd_avx(auVar61,auVar60);
      local_840 = uStack_2010;
      uStack_838 = uStack_2008;
      local_850 = 0x7f0000007f;
      uStack_848 = 0x7f0000007f;
      auVar5._8_8_ = uStack_2008;
      auVar5._0_8_ = uStack_2010;
      auVar3._8_8_ = 0x7f0000007f;
      auVar3._0_8_ = 0x7f0000007f;
      local_9a0 = vpaddd_avx(auVar5,auVar3);
      local_a40 = local_990._0_8_;
      uStack_a38 = local_990._8_8_;
      uStack_a30 = local_9a0._0_8_;
      uStack_a28 = local_9a0._8_8_;
      local_9e0 = local_990._0_8_;
      uStack_9d8 = local_990._8_8_;
      uStack_9d0 = local_9a0._0_8_;
      uStack_9c8 = local_9a0._8_8_;
      local_8a0 = local_990._0_8_;
      uStack_898 = local_990._8_8_;
      uStack_890 = local_9a0._0_8_;
      uStack_888 = local_9a0._8_8_;
      local_8a4 = 0x17;
      local_920 = local_990._0_8_;
      uStack_918 = local_990._8_8_;
      uStack_910 = local_9a0._0_8_;
      uStack_908 = local_9a0._8_8_;
      local_7c0 = local_990._0_8_;
      uStack_7b8 = local_990._8_8_;
      local_7c4 = 0x17;
      local_8c0 = vpslld_avx(local_990,ZEXT416(0x17));
      local_7e0 = local_9a0._0_8_;
      uStack_7d8 = local_9a0._8_8_;
      local_7e4 = 0x17;
      local_8d0 = vpslld_avx(local_9a0,ZEXT416(0x17));
      local_940 = local_8c0._0_8_;
      uStack_938 = local_8c0._8_8_;
      uStack_930 = local_8d0._0_8_;
      uStack_928 = local_8d0._8_8_;
      local_900 = local_8c0._0_8_;
      uStack_8f8 = local_8c0._8_8_;
      uStack_8f0 = local_8d0._0_8_;
      uStack_8e8 = local_8d0._8_8_;
      local_2020 = local_8c0._0_8_;
      uStack_2018 = local_8c0._8_8_;
      uStack_2010 = local_8d0._0_8_;
      uStack_2008 = local_8d0._8_8_;
      local_880 = local_8c0._0_8_;
      uStack_878 = local_8c0._8_8_;
      uStack_870 = local_8d0._0_8_;
      uStack_868 = local_8d0._8_8_;
      local_20a0 = local_8c0._0_8_;
      uStack_2098 = local_8c0._8_8_;
      uStack_2090 = local_8d0._0_8_;
      uStack_2088 = local_8d0._8_8_;
      local_15e0 = local_2080;
      uStack_15d8 = uStack_2078;
      uStack_2070 = auVar96._16_8_;
      uStack_15d0 = uStack_2070;
      uStack_2068 = auVar1._24_8_;
      uStack_15c8 = uStack_2068;
      local_1600 = local_8c0._0_8_;
      uStack_15f8 = local_8c0._8_8_;
      uStack_15f0 = local_8d0._0_8_;
      uStack_15e8 = local_8d0._8_8_;
      local_2080._0_4_ = ((float)local_1f20 + 1.0) * local_8c0._0_4_;
      local_2080._4_4_ = (local_1f20._4_4_ + 1.0) * local_8c0._4_4_;
      fVar98 = ((float)uStack_1f18 + 1.0) * local_8c0._8_4_;
      fVar99 = (uStack_1f18._4_4_ + 1.0) * local_8c0._12_4_;
      fVar100 = local_8d0._0_4_ * 1.0;
      fVar101 = local_8d0._4_4_ * 1.0;
      fVar102 = local_8d0._8_4_ * 1.0;
      uStack_2078._0_4_ = fVar98;
      uStack_2078._4_4_ = fVar99;
      uStack_2070._0_4_ = fVar100;
      uStack_2070._4_4_ = fVar101;
      auVar96 = _local_2080;
      uStack_2068._0_4_ = fVar102;
      uStack_2068._4_4_ = 0x3f800000;
      auVar24 = _local_2080;
      local_20e0 = local_2080;
      uStack_20d8 = uStack_2078;
      uStack_2070 = auVar96._16_8_;
      uStack_20d0 = uStack_2070;
      uStack_2068 = auVar24._24_8_;
      uStack_20c8 = uStack_2068;
      local_20c0._0_4_ = local_1940._0_4_;
      local_20c0._4_4_ = local_1940._4_4_;
      uStack_20b8._0_4_ = local_1940._8_4_;
      uStack_20b8._4_4_ = local_1940._12_4_;
      uStack_20b0._0_4_ = auStack_1930._0_4_;
      uStack_20b0._4_4_ = auStack_1930._4_4_;
      uStack_20a8._0_4_ = auStack_1930._8_4_;
      uStack_20a8._4_4_ = auStack_1930._12_4_;
      auVar95._0_8_ =
           CONCAT44(local_20c0._4_4_ + (float)local_2080._4_4_,
                    (float)local_20c0 + (float)local_2080._0_4_);
      auVar95._8_4_ = (float)uStack_20b8 + fVar98;
      auVar95._12_4_ = uStack_20b8._4_4_ + fVar99;
      auVar96._16_4_ = (float)uStack_20b0 + fVar100;
      auVar96._0_16_ = auVar95;
      auVar96._20_4_ = uStack_20b0._4_4_ + fVar101;
      auVar97._24_4_ = (float)uStack_20a8 + fVar102;
      auVar97._0_24_ = auVar96;
      auVar97._28_4_ = uStack_20a8._4_4_ + 1.0;
      local_22c0 = ZEXT1632(ZEXT816(0) << 0x40);
      local_2340 = vcmpps_avx(auVar97,local_22c0,2);
      uStack_22d8 = auVar95._8_8_;
      uStack_1898 = uStack_22d8;
      uStack_22d0 = auVar96._16_8_;
      uStack_1890 = uStack_22d0;
      uStack_22c8 = auVar97._24_8_;
      uStack_1888 = uStack_22c8;
      local_18c0 = 0x80000000800000;
      uStack_18b8 = 0x80000000800000;
      uStack_18b0 = 0x80000000800000;
      uStack_18a8 = 0x80000000800000;
      auVar36._16_8_ = uStack_22d0;
      auVar36._0_16_ = auVar95;
      auVar36._24_8_ = uStack_22c8;
      auVar35._8_8_ = 0x80000000800000;
      auVar35._0_8_ = 0x80000000800000;
      auVar35._16_8_ = 0x80000000800000;
      auVar35._24_8_ = 0x80000000800000;
      auVar1 = vmaxps_avx(auVar36,auVar35);
      local_22e0 = auVar1._0_8_;
      local_17c0 = local_22e0;
      uStack_22d8 = auVar1._8_8_;
      uStack_17b8 = uStack_22d8;
      uStack_22d0 = auVar1._16_8_;
      uStack_17b0 = uStack_22d0;
      uStack_22c8 = auVar1._24_8_;
      uStack_17a8 = uStack_22c8;
      local_17e0 = local_22e0;
      uStack_17d8 = uStack_22d8;
      uStack_17d0 = uStack_22d0;
      uStack_17c8 = uStack_22c8;
      local_17e4 = 0x17;
      local_1860 = local_22e0;
      uStack_1858 = uStack_22d8;
      uStack_1850 = uStack_22d0;
      uStack_1848 = uStack_22c8;
      local_12b0 = local_22e0;
      uStack_12a8 = uStack_22d8;
      local_12b4 = 0x17;
      local_1800 = vpsrld_avx(auVar1._0_16_,ZEXT416(0x17));
      local_12d0 = uStack_22d0;
      uStack_12c8 = uStack_22c8;
      local_12d4 = 0x17;
      local_1810 = vpsrld_avx(auVar1._16_16_,ZEXT416(0x17));
      local_1880 = local_1800._0_8_;
      uStack_1878 = local_1800._8_8_;
      uStack_1870 = local_1810._0_8_;
      uStack_1868 = local_1810._8_8_;
      local_1840 = local_1800._0_8_;
      uStack_1838 = local_1800._8_8_;
      uStack_1830 = local_1810._0_8_;
      uStack_1828 = local_1810._8_8_;
      local_2200 = local_22e0;
      uStack_21f8 = uStack_22d8;
      uStack_21f0 = uStack_22d0;
      uStack_21e8 = uStack_22c8;
      local_2220 = 0x807fffff807fffff;
      uStack_2218 = 0x807fffff807fffff;
      uStack_2210 = 0x807fffff807fffff;
      uStack_2208 = 0x807fffff807fffff;
      auVar23._8_8_ = 0x807fffff807fffff;
      auVar23._0_8_ = 0x807fffff807fffff;
      auVar23._16_8_ = 0x807fffff807fffff;
      auVar23._24_8_ = 0x807fffff807fffff;
      auVar1 = vandps_avx(auVar1,auVar23);
      local_22e0 = auVar1._0_8_;
      local_1740 = local_22e0;
      uStack_22d8 = auVar1._8_8_;
      uStack_1738 = uStack_22d8;
      uStack_22d0 = auVar1._16_8_;
      uStack_1730 = uStack_22d0;
      uStack_22c8 = auVar1._24_8_;
      uStack_1728 = uStack_22c8;
      local_1760 = 0x3f0000003f000000;
      uStack_1758 = 0x3f0000003f000000;
      uStack_1750 = 0x3f0000003f000000;
      uStack_1748 = 0x3f0000003f000000;
      auVar37._8_8_ = 0x3f0000003f000000;
      auVar37._0_8_ = 0x3f0000003f000000;
      auVar37._16_8_ = 0x3f0000003f000000;
      auVar37._24_8_ = 0x3f0000003f000000;
      auVar6 = vorps_avx(auVar1,auVar37);
      local_1640 = local_1800._0_8_;
      uStack_1638 = local_1800._8_8_;
      uStack_1630 = local_1810._0_8_;
      uStack_1628 = local_1810._8_8_;
      local_16e0 = local_1800._0_8_;
      uStack_16d8 = local_1800._8_8_;
      uStack_16d0 = local_1810._0_8_;
      uStack_16c8 = local_1810._8_8_;
      local_1700 = 0x7f0000007f;
      uStack_16f8 = 0x7f0000007f;
      uStack_16f0 = 0x7f0000007f;
      uStack_16e8 = 0x7f0000007f;
      local_1690 = 0x7f0000007f;
      uStack_1688 = 0x7f0000007f;
      local_16a0 = 0x7f0000007f;
      uStack_1698 = 0x7f0000007f;
      local_1250 = local_1800._0_8_;
      uStack_1248 = local_1800._8_8_;
      local_1260 = 0x7f0000007f;
      uStack_1258 = 0x7f0000007f;
      auVar7._8_8_ = 0x7f0000007f;
      auVar7._0_8_ = 0x7f0000007f;
      local_1670 = vpsubd_avx(local_1800,auVar7);
      local_1270 = local_1810._0_8_;
      uStack_1268 = local_1810._8_8_;
      local_1280 = 0x7f0000007f;
      uStack_1278 = 0x7f0000007f;
      auVar4._8_8_ = 0x7f0000007f;
      auVar4._0_8_ = 0x7f0000007f;
      local_1680 = vpsubd_avx(local_1810,auVar4);
      local_1720 = local_1670._0_8_;
      uStack_1718 = local_1670._8_8_;
      uStack_1710 = local_1680._0_8_;
      uStack_1708 = local_1680._8_8_;
      local_16c0 = local_1670._0_8_;
      uStack_16b8 = local_1670._8_8_;
      uStack_16b0 = local_1680._0_8_;
      uStack_16a8 = local_1680._8_8_;
      local_2300 = local_1670._0_8_;
      uStack_22f8 = local_1670._8_8_;
      uStack_22f0 = local_1680._0_8_;
      uStack_22e8 = local_1680._8_8_;
      local_1620 = local_1670._0_8_;
      uStack_1618 = local_1670._8_8_;
      uStack_1610 = local_1680._0_8_;
      uStack_1608 = local_1680._8_8_;
      auVar38._16_8_ = local_1680._0_8_;
      auVar38._0_16_ = local_1670;
      auVar38._24_8_ = local_1680._8_8_;
      auVar1 = vcvtdq2ps_avx(auVar38);
      local_2360 = auVar1._0_8_;
      uVar11 = local_2360;
      uStack_2358 = auVar1._8_8_;
      uVar12 = uStack_2358;
      uStack_2350 = auVar1._16_8_;
      uVar13 = uStack_2350;
      uStack_2348 = auVar1._24_8_;
      uVar14 = uStack_2348;
      local_2160 = 0x3f8000003f800000;
      uStack_2158 = 0x3f8000003f800000;
      uStack_2150 = 0x3f8000003f800000;
      uStack_2148 = 0x3f8000003f800000;
      local_2140._0_4_ = auVar1._0_4_;
      local_2140._4_4_ = auVar1._4_4_;
      uStack_2138._0_4_ = auVar1._8_4_;
      uStack_2138._4_4_ = auVar1._12_4_;
      uStack_2130._0_4_ = auVar1._16_4_;
      uStack_2130._4_4_ = auVar1._20_4_;
      uStack_2128._0_4_ = auVar1._24_4_;
      uStack_2128._4_4_ = auVar1._28_4_;
      local_2360._4_4_ = local_2140._4_4_ + 1.0;
      local_2360._0_4_ = (float)local_2140 + 1.0;
      uStack_2358._0_4_ = (float)uStack_2138 + 1.0;
      uStack_2358._4_4_ = uStack_2138._4_4_ + 1.0;
      uStack_2350._0_4_ = (float)uStack_2130 + 1.0;
      uStack_2350._4_4_ = uStack_2130._4_4_ + 1.0;
      auVar96 = _local_2360;
      uStack_2348._0_4_ = (float)uStack_2128 + 1.0;
      uStack_2348._4_4_ = uStack_2128._4_4_ + 1.0;
      auVar8 = _local_2360;
      local_2380 = vcmpps_avx(auVar6,_DAT_01f94420,1);
      local_22e0 = auVar6._0_8_;
      local_2240 = local_22e0;
      uStack_22d8 = auVar6._8_8_;
      uStack_2238 = uStack_22d8;
      uStack_22d0 = auVar6._16_8_;
      uStack_2230 = uStack_22d0;
      uStack_22c8 = auVar6._24_8_;
      uStack_2228 = uStack_22c8;
      local_2260 = local_2380._0_8_;
      uStack_2258 = local_2380._8_8_;
      uStack_2250 = local_2380._16_8_;
      uStack_2248 = local_2380._24_8_;
      local_23a0 = vandps_avx(auVar6,local_2380);
      local_1e60 = local_22e0;
      uStack_1e58 = uStack_22d8;
      uStack_1e50 = uStack_22d0;
      uStack_1e48 = uStack_22c8;
      local_1e80 = 0x3f8000003f800000;
      uStack_1e78 = 0x3f8000003f800000;
      uStack_1e70 = 0x3f8000003f800000;
      uStack_1e68 = 0x3f8000003f800000;
      auVar26._8_8_ = 0x3f8000003f800000;
      auVar26._0_8_ = 0x3f8000003f800000;
      auVar26._16_8_ = 0x3f8000003f800000;
      auVar26._24_8_ = 0x3f8000003f800000;
      auVar1 = vsubps_avx(auVar6,auVar26);
      local_1ea0 = local_2360;
      uStack_1e98 = uStack_2358;
      uStack_2350 = auVar96._16_8_;
      uStack_1e90 = uStack_2350;
      uStack_2348 = auVar8._24_8_;
      uStack_1e88 = uStack_2348;
      local_2280 = 0x3f8000003f800000;
      uStack_2278 = 0x3f8000003f800000;
      uStack_2270 = 0x3f8000003f800000;
      uStack_2268 = 0x3f8000003f800000;
      local_22a0 = local_2380._0_8_;
      uStack_2298 = local_2380._8_8_;
      uStack_2290 = local_2380._16_8_;
      uStack_2288 = local_2380._24_8_;
      auVar8._8_8_ = 0x3f8000003f800000;
      auVar8._0_8_ = 0x3f8000003f800000;
      auVar8._16_8_ = 0x3f8000003f800000;
      auVar8._24_8_ = 0x3f8000003f800000;
      local_1ec0 = vandps_avx(auVar8,local_2380);
      auVar25._16_8_ = uStack_2350;
      auVar25._0_16_ = _local_2360;
      auVar25._24_8_ = uStack_2348;
      _local_2360 = vsubps_avx(auVar25,local_1ec0);
      local_22e0 = auVar1._0_8_;
      uVar15 = local_22e0;
      uStack_22d8 = auVar1._8_8_;
      uVar16 = uStack_22d8;
      uStack_22d0 = auVar1._16_8_;
      uVar17 = uStack_22d0;
      uStack_22c8 = auVar1._24_8_;
      uVar18 = uStack_22c8;
      local_2180._0_4_ = auVar1._0_4_;
      local_2180._4_4_ = auVar1._4_4_;
      uStack_2178._0_4_ = auVar1._8_4_;
      uStack_2178._4_4_ = auVar1._12_4_;
      uStack_2170._0_4_ = auVar1._16_4_;
      uStack_2170._4_4_ = auVar1._20_4_;
      uStack_2168._0_4_ = auVar1._24_4_;
      uStack_2168._4_4_ = auVar1._28_4_;
      local_21a0._0_4_ = local_23a0._0_4_;
      local_21a0._4_4_ = local_23a0._4_4_;
      uStack_2198._0_4_ = local_23a0._8_4_;
      uStack_2198._4_4_ = local_23a0._12_4_;
      uStack_2190._0_4_ = local_23a0._16_4_;
      uStack_2190._4_4_ = local_23a0._20_4_;
      uStack_2188._0_4_ = local_23a0._24_4_;
      uStack_2188._4_4_ = local_23a0._28_4_;
      local_22e0._0_4_ = (float)local_2180 + (float)local_21a0;
      local_22e0._4_4_ = local_2180._4_4_ + local_21a0._4_4_;
      uStack_2178._0_4_ = (float)uStack_2178 + (float)uStack_2198;
      uStack_2178._4_4_ = uStack_2178._4_4_ + uStack_2198._4_4_;
      uStack_2170._0_4_ = (float)uStack_2170 + (float)uStack_2190;
      uStack_2170._4_4_ = uStack_2170._4_4_ + uStack_2190._4_4_;
      uStack_2168._0_4_ = (float)uStack_2168 + (float)uStack_2188;
      fStack_23a4 = uStack_2168._4_4_ + uStack_2188._4_4_;
      uStack_22d8._0_4_ = (float)uStack_2178;
      uStack_22d8._4_4_ = uStack_2178._4_4_;
      uStack_22d0._0_4_ = (float)uStack_2170;
      uStack_22d0._4_4_ = uStack_2170._4_4_;
      auVar96 = _local_22e0;
      uStack_22c8._0_4_ = (float)uStack_2168;
      uStack_22c8._4_4_ = fStack_23a4;
      auVar1 = _local_22e0;
      local_1500 = local_22e0;
      uStack_14f8 = uStack_22d8;
      uStack_22d0 = auVar96._16_8_;
      uStack_14f0 = uStack_22d0;
      uStack_22c8 = auVar1._24_8_;
      uStack_14e8 = uStack_22c8;
      local_23c0 = (float)local_22e0._0_4_ * (float)local_22e0._0_4_;
      fStack_23bc = (float)local_22e0._4_4_ * (float)local_22e0._4_4_;
      fStack_23b8 = (float)uStack_2178 * (float)uStack_2178;
      fStack_23b4 = uStack_2178._4_4_ * uStack_2178._4_4_;
      fStack_23b0 = (float)uStack_2170 * (float)uStack_2170;
      fStack_23ac = uStack_2170._4_4_ * uStack_2170._4_4_;
      fStack_23a8 = (float)uStack_2168 * (float)uStack_2168;
      uStack_23d8 = 0x3d9021bb3d9021bb;
      local_23e0 = (undefined1  [8])0x3d9021bb3d9021bb;
      uStack_23d0 = 0x3d9021bb3d9021bb;
      uStack_23c8 = 0x3d9021bb3d9021bb;
      local_13f8 = local_23e0;
      local_13d8 = local_22e0;
      local_1338 = ::_ps256_cephes_log_p1;
      local_11e0 = 0x3d9021bb3d9021bb;
      uStack_11d8 = 0x3d9021bb3d9021bb;
      uStack_11d0 = 0x3d9021bb3d9021bb;
      uStack_11c8 = 0x3d9021bb3d9021bb;
      local_1200 = local_22e0;
      uStack_11f8 = uStack_22d8;
      uStack_11f0 = uStack_22d0;
      uStack_11e8 = uStack_22c8;
      local_1220[0] = -0.1151461;
      local_1220[1] = -0.1151461;
      afStack_1218[0] = -0.1151461;
      afStack_1218[1] = -0.1151461;
      afStack_1210[0] = -0.1151461;
      afStack_1210[1] = -0.1151461;
      afStack_1208[0] = -0.1151461;
      afStack_1208[1] = -0.1151461;
      auVar40._8_4_ = -0.1151461;
      auVar40._12_4_ = -0.1151461;
      auVar40._0_4_ = -0.1151461;
      auVar40._4_4_ = -0.1151461;
      auVar40._16_4_ = -0.1151461;
      auVar40._20_4_ = -0.1151461;
      auVar40._24_4_ = -0.1151461;
      auVar40._28_4_ = -0.1151461;
      auVar4 = vfmadd213ps_fma(auVar1,_local_23e0,auVar40);
      local_1350 = ::_ps256_cephes_log_p2;
      local_23e0 = auVar4._0_8_;
      local_1180 = local_23e0;
      uStack_23d8 = auVar4._8_8_;
      uStack_1178 = uStack_23d8;
      uStack_1170 = 0;
      uStack_1168 = 0;
      local_11a0 = local_22e0;
      uStack_1198 = uStack_22d8;
      uStack_1190 = uStack_22d0;
      uStack_1188 = uStack_22c8;
      local_11c0[0] = 0.116769984;
      local_11c0[1] = 0.116769984;
      afStack_11b8[0] = 0.116769984;
      afStack_11b8[1] = 0.116769984;
      afStack_11b0[0] = 0.116769984;
      afStack_11b0[1] = 0.116769984;
      afStack_11a8[0] = 0.116769984;
      afStack_11a8[1] = 0.116769984;
      auVar41._8_4_ = 0.116769984;
      auVar41._12_4_ = 0.116769984;
      auVar41._0_4_ = 0.116769984;
      auVar41._4_4_ = 0.116769984;
      auVar41._16_4_ = 0.116769984;
      auVar41._20_4_ = 0.116769984;
      auVar41._24_4_ = 0.116769984;
      auVar41._28_4_ = 0.116769984;
      auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar41);
      local_1368 = ::_ps256_cephes_log_p3;
      local_23e0 = auVar4._0_8_;
      local_1120 = local_23e0;
      uStack_23d8 = auVar4._8_8_;
      uStack_1118 = uStack_23d8;
      uStack_1110 = 0;
      uStack_1108 = 0;
      local_1140 = local_22e0;
      uStack_1138 = uStack_22d8;
      uStack_1130 = uStack_22d0;
      uStack_1128 = uStack_22c8;
      local_1160[0] = -0.12420141;
      local_1160[1] = -0.12420141;
      afStack_1158[0] = -0.12420141;
      afStack_1158[1] = -0.12420141;
      afStack_1150[0] = -0.12420141;
      afStack_1150[1] = -0.12420141;
      afStack_1148[0] = -0.12420141;
      afStack_1148[1] = -0.12420141;
      auVar42._8_4_ = -0.12420141;
      auVar42._12_4_ = -0.12420141;
      auVar42._0_4_ = -0.12420141;
      auVar42._4_4_ = -0.12420141;
      auVar42._16_4_ = -0.12420141;
      auVar42._20_4_ = -0.12420141;
      auVar42._24_4_ = -0.12420141;
      auVar42._28_4_ = -0.12420141;
      auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar42);
      local_1380 = ::_ps256_cephes_log_p4;
      local_23e0 = auVar4._0_8_;
      local_10c0 = local_23e0;
      uStack_23d8 = auVar4._8_8_;
      uStack_10b8 = uStack_23d8;
      uStack_10b0 = 0;
      uStack_10a8 = 0;
      local_10e0 = local_22e0;
      uStack_10d8 = uStack_22d8;
      uStack_10d0 = uStack_22d0;
      uStack_10c8 = uStack_22c8;
      local_1100[0] = 0.14249323;
      local_1100[1] = 0.14249323;
      afStack_10f8[0] = 0.14249323;
      afStack_10f8[1] = 0.14249323;
      afStack_10f0[0] = 0.14249323;
      afStack_10f0[1] = 0.14249323;
      afStack_10e8[0] = 0.14249323;
      afStack_10e8[1] = 0.14249323;
      auVar43._8_4_ = 0.14249323;
      auVar43._12_4_ = 0.14249323;
      auVar43._0_4_ = 0.14249323;
      auVar43._4_4_ = 0.14249323;
      auVar43._16_4_ = 0.14249323;
      auVar43._20_4_ = 0.14249323;
      auVar43._24_4_ = 0.14249323;
      auVar43._28_4_ = 0.14249323;
      auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar43);
      local_1398 = ::_ps256_cephes_log_p5;
      local_23e0 = auVar4._0_8_;
      local_1060 = local_23e0;
      uStack_23d8 = auVar4._8_8_;
      uStack_1058 = uStack_23d8;
      uStack_1050 = 0;
      uStack_1048 = 0;
      local_1080 = local_22e0;
      uStack_1078 = uStack_22d8;
      uStack_1070 = uStack_22d0;
      uStack_1068 = uStack_22c8;
      local_10a0[0] = -0.16668057;
      local_10a0[1] = -0.16668057;
      afStack_1098[0] = -0.16668057;
      afStack_1098[1] = -0.16668057;
      afStack_1090[0] = -0.16668057;
      afStack_1090[1] = -0.16668057;
      afStack_1088[0] = -0.16668057;
      afStack_1088[1] = -0.16668057;
      auVar44._8_4_ = -0.16668057;
      auVar44._12_4_ = -0.16668057;
      auVar44._0_4_ = -0.16668057;
      auVar44._4_4_ = -0.16668057;
      auVar44._16_4_ = -0.16668057;
      auVar44._20_4_ = -0.16668057;
      auVar44._24_4_ = -0.16668057;
      auVar44._28_4_ = -0.16668057;
      auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar44);
      local_13b0 = ::_ps256_cephes_log_p6;
      local_23e0 = auVar4._0_8_;
      local_1000 = local_23e0;
      uStack_23d8 = auVar4._8_8_;
      uStack_ff8 = uStack_23d8;
      uStack_ff0 = 0;
      uStack_fe8 = 0;
      local_1020 = local_22e0;
      uStack_1018 = uStack_22d8;
      uStack_1010 = uStack_22d0;
      uStack_1008 = uStack_22c8;
      local_1040[0] = 0.20000714;
      local_1040[1] = 0.20000714;
      afStack_1038[0] = 0.20000714;
      afStack_1038[1] = 0.20000714;
      afStack_1030[0] = 0.20000714;
      afStack_1030[1] = 0.20000714;
      afStack_1028[0] = 0.20000714;
      afStack_1028[1] = 0.20000714;
      auVar45._8_4_ = 0.20000714;
      auVar45._12_4_ = 0.20000714;
      auVar45._0_4_ = 0.20000714;
      auVar45._4_4_ = 0.20000714;
      auVar45._16_4_ = 0.20000714;
      auVar45._20_4_ = 0.20000714;
      auVar45._24_4_ = 0.20000714;
      auVar45._28_4_ = 0.20000714;
      auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar45);
      local_13c8 = ::_ps256_cephes_log_p7;
      local_23e0 = auVar4._0_8_;
      local_fa0 = local_23e0;
      uStack_23d8 = auVar4._8_8_;
      uStack_f98 = uStack_23d8;
      uStack_f90 = 0;
      uStack_f88 = 0;
      local_fc0 = local_22e0;
      uStack_fb8 = uStack_22d8;
      uStack_fb0 = uStack_22d0;
      uStack_fa8 = uStack_22c8;
      local_fe0[0] = -0.24999994;
      local_fe0[1] = -0.24999994;
      afStack_fd8[0] = -0.24999994;
      afStack_fd8[1] = -0.24999994;
      afStack_fd0[0] = -0.24999994;
      afStack_fd0[1] = -0.24999994;
      afStack_fc8[0] = -0.24999994;
      afStack_fc8[1] = -0.24999994;
      auVar46._8_4_ = -0.24999994;
      auVar46._12_4_ = -0.24999994;
      auVar46._0_4_ = -0.24999994;
      auVar46._4_4_ = -0.24999994;
      auVar46._16_4_ = -0.24999994;
      auVar46._20_4_ = -0.24999994;
      auVar46._24_4_ = -0.24999994;
      auVar46._28_4_ = -0.24999994;
      auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar46);
      local_13e0 = ::_ps256_cephes_log_p8;
      local_23e0 = auVar4._0_8_;
      local_f40 = local_23e0;
      uStack_23d8 = auVar4._8_8_;
      uStack_f38 = uStack_23d8;
      uStack_f30 = 0;
      uStack_f28 = 0;
      local_f60 = local_22e0;
      uStack_f58 = uStack_22d8;
      uStack_f50 = uStack_22d0;
      uStack_f48 = uStack_22c8;
      local_f80[0] = 0.3333333;
      local_f80[1] = 0.3333333;
      afStack_f78[0] = 0.3333333;
      afStack_f78[1] = 0.3333333;
      afStack_f70[0] = 0.3333333;
      afStack_f70[1] = 0.3333333;
      afStack_f68[0] = 0.3333333;
      afStack_f68[1] = 0.3333333;
      auVar47._8_4_ = 0.3333333;
      auVar47._12_4_ = 0.3333333;
      auVar47._0_4_ = 0.3333333;
      auVar47._4_4_ = 0.3333333;
      auVar47._16_4_ = 0.3333333;
      auVar47._20_4_ = 0.3333333;
      auVar47._24_4_ = 0.3333333;
      auVar47._28_4_ = 0.3333333;
      auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar47);
      local_23e0 = auVar4._0_8_;
      uVar19 = local_23e0;
      uStack_23d8 = auVar4._8_8_;
      uVar20 = uStack_23d8;
      uStack_1510 = 0;
      uStack_1508 = 0;
      local_1540 = local_22e0;
      uStack_1538 = uStack_22d8;
      uStack_1530 = uStack_22d0;
      uStack_1528 = uStack_22c8;
      local_1520._0_4_ = auVar4._0_4_;
      local_1520._4_4_ = auVar4._4_4_;
      uStack_1518._0_4_ = auVar4._8_4_;
      uStack_1518._4_4_ = auVar4._12_4_;
      local_23e0._4_4_ = local_1520._4_4_ * (float)local_22e0._4_4_;
      local_23e0._0_4_ = (float)local_1520 * (float)local_22e0._0_4_;
      uStack_23d8._0_4_ = (float)uStack_1518 * (float)uStack_2178;
      uStack_23d8._4_4_ = uStack_1518._4_4_ * uStack_2178._4_4_;
      uStack_23d0._0_4_ = (float)uStack_2170 * 0.0;
      uStack_23d0._4_4_ = uStack_2170._4_4_ * 0.0;
      auVar96 = _local_23e0;
      local_1560 = local_23e0;
      uStack_1558 = uStack_23d8;
      uStack_23d0 = auVar96._16_8_;
      uStack_1550 = uStack_23d0;
      uStack_23c8 = (ulong)(uint)((float)uStack_2168 * 0.0);
      uStack_1548 = uStack_23c8;
      local_1580 = CONCAT44(fStack_23bc,local_23c0);
      uStack_1578 = CONCAT44(fStack_23b4,fStack_23b8);
      uStack_1570 = CONCAT44(fStack_23ac,fStack_23b0);
      uStack_1568 = CONCAT44(fStack_23a4,fStack_23a8);
      uStack_23c8._0_4_ = (float)uStack_2168 * 0.0 * fStack_23a8;
      local_23e0._4_4_ = local_1520._4_4_ * (float)local_22e0._4_4_ * fStack_23bc;
      local_23e0._0_4_ = (float)local_1520 * (float)local_22e0._0_4_ * local_23c0;
      uStack_23d8._0_4_ = (float)uStack_1518 * (float)uStack_2178 * fStack_23b8;
      uStack_23d8._4_4_ = uStack_1518._4_4_ * uStack_2178._4_4_ * fStack_23b4;
      uStack_23d0._0_4_ = (float)uStack_2170 * 0.0 * fStack_23b0;
      uStack_23d0._4_4_ = uStack_2170._4_4_ * 0.0 * fStack_23ac;
      auVar96 = _local_23e0;
      uStack_23c8._4_4_ = 0;
      auVar1 = _local_23e0;
      local_13e8 = local_2360;
      local_13f0 = ::_ps256_cephes_log_q1;
      local_ee0 = local_2360;
      uStack_ed8 = uStack_2358;
      uStack_ed0 = uStack_2350;
      uStack_ec8 = uStack_2348;
      local_f00[0] = -0.00021219444;
      local_f00[1] = -0.00021219444;
      afStack_ef8[0] = -0.00021219444;
      afStack_ef8[1] = -0.00021219444;
      afStack_ef0[0] = -0.00021219444;
      afStack_ef0[1] = -0.00021219444;
      afStack_ee8[0] = -0.00021219444;
      afStack_ee8[1] = -0.00021219444;
      local_f20 = local_23e0;
      uStack_f18 = uStack_23d8;
      uStack_23d0 = auVar96._16_8_;
      uStack_f10 = uStack_23d0;
      uStack_23c8 = (ulong)(uint)(float)uStack_23c8;
      uStack_f08 = uStack_23c8;
      auVar48._8_4_ = -0.00021219444;
      auVar48._12_4_ = -0.00021219444;
      auVar48._0_4_ = -0.00021219444;
      auVar48._4_4_ = -0.00021219444;
      auVar48._16_4_ = -0.00021219444;
      auVar48._20_4_ = -0.00021219444;
      auVar48._24_4_ = -0.00021219444;
      auVar48._28_4_ = -0.00021219444;
      auVar4 = vfmadd213ps_fma(auVar48,_local_2360,auVar1);
      local_12e0 = &local_23c0;
      local_12e8 = ::_ps256_0p5;
      local_b80 = CONCAT44(fStack_23bc,local_23c0);
      uStack_b78 = CONCAT44(fStack_23b4,fStack_23b8);
      uStack_b70 = CONCAT44(fStack_23ac,fStack_23b0);
      uStack_b68 = CONCAT44(fStack_23a4,fStack_23a8);
      local_ba0[0] = 0.5;
      local_ba0[1] = 0.5;
      afStack_b98[0] = 0.5;
      afStack_b98[1] = 0.5;
      afStack_b90[0] = 0.5;
      afStack_b90[1] = 0.5;
      afStack_b88[0] = 0.5;
      afStack_b88[1] = 0.5;
      local_23e0 = auVar4._0_8_;
      local_bc0 = local_23e0;
      uStack_23d8 = auVar4._8_8_;
      uStack_bb8 = uStack_23d8;
      uStack_bb0 = 0;
      uStack_ba8 = 0;
      auVar94._0_8_ = local_b80 ^ 0x8000000080000000;
      auVar94._8_4_ = -fStack_23b8;
      auVar94._12_4_ = -fStack_23b4;
      auVar94._16_4_ = -fStack_23b0;
      auVar94._20_4_ = -fStack_23ac;
      auVar94._24_4_ = -fStack_23a8;
      auVar94._28_4_ = -fStack_23a4;
      auVar56._8_4_ = 0.5;
      auVar56._12_4_ = 0.5;
      auVar56._0_4_ = 0.5;
      auVar56._4_4_ = 0.5;
      auVar56._16_4_ = 0.5;
      auVar56._20_4_ = 0.5;
      auVar56._24_4_ = 0.5;
      auVar56._28_4_ = 0.5;
      auVar4 = vfmadd213ps_fma(auVar56,auVar94,ZEXT1632(auVar4));
      local_21c0 = local_22e0;
      uStack_21b8 = uStack_22d8;
      uStack_21b0 = uStack_22d0;
      uStack_21a8 = uStack_22c8;
      local_23e0 = auVar4._0_8_;
      uVar21 = local_23e0;
      uStack_23d8 = auVar4._8_8_;
      uVar22 = uStack_23d8;
      uStack_21d0 = 0;
      uStack_21c8 = 0;
      local_21e0._0_4_ = auVar4._0_4_;
      local_21e0._4_4_ = auVar4._4_4_;
      uStack_21d8._0_4_ = auVar4._8_4_;
      uStack_21d8._4_4_ = auVar4._12_4_;
      local_22e0._4_4_ = (float)local_22e0._4_4_ + local_21e0._4_4_;
      local_22e0._0_4_ = (float)local_22e0._0_4_ + (float)local_21e0;
      uStack_22d8._0_4_ = (float)uStack_2178 + (float)uStack_21d8;
      uStack_22d8._4_4_ = uStack_2178._4_4_ + uStack_21d8._4_4_;
      uStack_22d0._0_4_ = (float)uStack_2170 + 0.0;
      uStack_22d0._4_4_ = uStack_2170._4_4_ + 0.0;
      auVar96 = _local_22e0;
      uStack_22c8._0_4_ = (float)uStack_2168 + 0.0;
      uStack_22c8._4_4_ = fStack_23a4 + 0.0;
      auVar1 = _local_22e0;
      local_1400 = local_2360;
      local_1408 = ::_ps256_cephes_log_q2;
      local_1410 = local_22e0;
      local_e80 = local_2360;
      uStack_e78 = uStack_2358;
      uStack_e70 = uStack_2350;
      uStack_e68 = uStack_2348;
      local_ea0[0] = 0.6933594;
      local_ea0[1] = 0.6933594;
      afStack_e98[0] = 0.6933594;
      afStack_e98[1] = 0.6933594;
      afStack_e90[0] = 0.6933594;
      afStack_e90[1] = 0.6933594;
      afStack_e88[0] = 0.6933594;
      afStack_e88[1] = 0.6933594;
      local_ec0 = local_22e0;
      uStack_eb8 = uStack_22d8;
      uStack_22d0 = auVar96._16_8_;
      uStack_eb0 = uStack_22d0;
      uStack_22c8 = auVar1._24_8_;
      uStack_ea8 = uStack_22c8;
      auVar49._8_4_ = 0.6933594;
      auVar49._12_4_ = 0.6933594;
      auVar49._0_4_ = 0.6933594;
      auVar49._4_4_ = 0.6933594;
      auVar49._16_4_ = 0.6933594;
      auVar49._20_4_ = 0.6933594;
      auVar49._24_4_ = 0.6933594;
      auVar49._28_4_ = 0.6933594;
      auVar4 = vfmadd213ps_fma(auVar49,_local_2360,auVar1);
      local_22e0 = auVar4._0_8_;
      local_1780 = local_22e0;
      uStack_22d8 = auVar4._8_8_;
      uStack_1778 = uStack_22d8;
      uStack_1770 = 0;
      uStack_1768 = 0;
      local_17a0 = local_2340._0_8_;
      uStack_1798 = local_2340._8_8_;
      uStack_1790 = local_2340._16_8_;
      uStack_1788 = local_2340._24_8_;
      _local_23e0 = vorps_avx(ZEXT1632(auVar4),local_2340);
      local_2620 = auVar2._0_8_;
      local_2460 = local_2620;
      uStack_2618 = auVar2._8_8_;
      uStack_2458 = uStack_2618;
      uStack_2610 = auVar2._16_8_;
      uStack_2450 = uStack_2610;
      uStack_2608 = auVar2._24_8_;
      uStack_2448 = uStack_2608;
      auVar1 = vandps_avx(*local_2540,auVar2);
      local_2680 = auVar1._0_8_;
      uStack_2678 = auVar1._8_8_;
      uStack_2670 = auVar1._16_8_;
      uStack_2668 = auVar1._24_8_;
      local_2100._0_4_ = auVar1._0_4_;
      local_2100._4_4_ = auVar1._4_4_;
      uStack_20f8._0_4_ = auVar1._8_4_;
      uStack_20f8._4_4_ = auVar1._12_4_;
      uStack_20f0._0_4_ = auVar1._16_4_;
      uStack_20f0._4_4_ = auVar1._20_4_;
      uStack_20e8._0_4_ = auVar1._24_4_;
      uStack_20e8._4_4_ = auVar1._28_4_;
      local_2120._0_4_ = local_23e0._0_4_;
      local_2120._4_4_ = local_23e0._4_4_;
      uStack_2118._0_4_ = local_23e0._8_4_;
      uStack_2118._4_4_ = local_23e0._12_4_;
      uStack_2110._0_4_ = local_23e0._16_4_;
      uStack_2110._4_4_ = local_23e0._20_4_;
      uStack_2108._0_4_ = local_23e0._24_4_;
      uStack_2108._4_4_ = local_23e0._28_4_;
      local_1dc8 = local_2540;
      local_1e00 = CONCAT44(local_2100._4_4_ + local_2120._4_4_,
                            (float)local_2100 + (float)local_2120);
      uStack_1df8 = CONCAT44(uStack_20f8._4_4_ + uStack_2118._4_4_,
                             (float)uStack_20f8 + (float)uStack_2118);
      uStack_1df0 = CONCAT44(uStack_20f0._4_4_ + uStack_2110._4_4_,
                             (float)uStack_20f0 + (float)uStack_2110);
      uStack_1de8 = CONCAT44(uStack_20e8._4_4_ + uStack_2108._4_4_,
                             (float)uStack_20e8 + (float)uStack_2108);
      *(undefined8 *)*local_2540 = local_1e00;
      *(undefined8 *)(*local_2540 + 8) = uStack_1df8;
      *(undefined8 *)(*local_2540 + 0x10) = uStack_1df0;
      *(undefined8 *)(*local_2540 + 0x18) = uStack_1de8;
      local_2540 = local_2540 + 1;
      local_2400 = local_2440;
      uStack_23f8 = uStack_2438;
      uStack_23f0 = uStack_2430;
      uStack_23e8 = uStack_2428;
      _local_22e0 = ZEXT1632(auVar4);
      local_21e0 = uVar21;
      uStack_21d8 = uVar22;
      local_21a0 = local_23a0._0_8_;
      uStack_2198 = local_23a0._8_8_;
      uStack_2190 = local_23a0._16_8_;
      uStack_2188 = local_23a0._24_8_;
      local_2180 = uVar15;
      uStack_2178 = uVar16;
      uStack_2170 = uVar17;
      uStack_2168 = uVar18;
      local_2140 = uVar11;
      uStack_2138 = uVar12;
      uStack_2130 = uVar13;
      uStack_2128 = uVar14;
      local_2120 = local_23e0;
      uStack_2118 = uStack_23d8;
      uStack_2110 = uStack_23d0;
      uStack_2108 = uStack_23c8;
      local_2100 = local_2680;
      uStack_20f8 = uStack_2678;
      uStack_20f0 = uStack_2670;
      uStack_20e8 = uStack_2668;
      local_20c0 = local_1940._0_8_;
      uStack_20b8 = local_1940._8_8_;
      uStack_20b0 = auStack_1930._0_8_;
      uStack_20a8 = auStack_1930._8_8_;
      _local_2080 = auVar24;
      local_2040 = local_2320;
      uStack_2038 = uStack_2318;
      uStack_2030 = uStack_2310;
      uStack_2028 = uStack_2308;
      _local_1fe0 = auVar34;
      local_1fc0 = auVar93;
      local_1fa0 = local_24c0;
      local_1f20 = uVar9;
      uStack_1f18 = uVar10;
      local_18a0 = auVar95._0_8_;
      local_15a0 = local_15c0;
      uStack_1598 = uStack_15b8;
      uStack_1590 = uStack_15b0;
      uStack_1588 = uStack_15a8;
      local_1520 = uVar19;
      uStack_1518 = uVar20;
      local_14e0 = local_1500;
      uStack_14d8 = uStack_14f8;
      uStack_14d0 = uStack_14f0;
      uStack_14c8 = uStack_14e8;
      local_1498 = local_14b8;
      local_1490 = local_14a8;
      local_1480 = local_14b8;
      local_1478 = local_14a8;
      local_1468 = local_14b8;
      local_1460 = local_14a8;
      local_1450 = local_14b8;
      local_1448 = local_14a8;
      local_1438 = local_14b8;
      local_1430 = local_14a8;
      local_1418 = local_14b8;
      local_13d0 = local_13f8;
      local_13c0 = local_13d8;
      local_13b8 = local_13f8;
      local_13a8 = local_13d8;
      local_13a0 = local_13f8;
      local_1390 = local_13d8;
      local_1388 = local_13f8;
      local_1378 = local_13d8;
      local_1370 = local_13f8;
      local_1360 = local_13d8;
      local_1358 = local_13f8;
      local_1348 = local_13d8;
      local_1340 = local_13f8;
      local_1330 = local_13d8;
      local_1328 = local_13f8;
      local_1320 = local_14b8;
      local_1308 = local_14b8;
      local_12f8 = local_1310;
      local_12f0 = local_13f8;
      local_a60 = local_2000._0_8_;
      uStack_a58 = local_2000._8_8_;
      uStack_a50 = local_2000._16_8_;
      uStack_a48 = local_2000._24_8_;
      local_980 = local_1660;
      uStack_978 = uStack_1658;
      uStack_970 = uStack_1650;
      uStack_968 = uStack_1648;
    }
    local_1da4 = 0x3f800000;
    local_1dc0 = 0x3f800000;
    uStack_1dbc = 0x3f800000;
    uStack_1db8 = 0x3f800000;
    uStack_1db4 = 0x3f800000;
    local_1da0._8_8_ = SUB168(ZEXT816(0),4);
    for (; local_24a0 = ZEXT832(0) << 0x20, auVar4 = ZEXT816(0) << 0x20, local_1970 = local_24d8,
        local_2568 = local_19d0, local_2598 + 3 < local_2530; local_2598 = local_2598 + 4) {
      local_1d88 = local_2540;
      local_1d70 = *(undefined8 *)*local_2540;
      uStack_1d68 = *(undefined8 *)(*local_2540 + 8);
      local_1d80 = 0;
      uStack_1d78 = local_1da0._8_8_;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = local_1da0._8_8_;
      auVar4 = vcmpps_avx(auVar91 << 0x40,*(undefined1 (*) [16])*local_2540,1);
      local_1d40[0] = 0x7fffffff;
      local_1d40[1] = 0x7fffffff;
      aiStack_1d38[0] = 0x7fffffff;
      aiStack_1d38[1] = 0x7fffffff;
      auVar27._8_4_ = 0x7fffffff;
      auVar27._12_4_ = 0x7fffffff;
      auVar27._0_4_ = 0x7fffffff;
      auVar27._4_4_ = 0x7fffffff;
      auVar7 = vpand_avx(*(undefined1 (*) [16])*local_2540,auVar27);
      local_1a00 = 0;
      uStack_19f8 = local_1da0._8_8_;
      local_26d0 = auVar7._0_8_;
      local_1a10 = local_26d0;
      uStack_26c8 = auVar7._8_8_;
      uStack_1a08 = uStack_26c8;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = local_1da0._8_8_;
      auVar7 = vsubps_avx(auVar92 << 0x40,auVar7);
      local_1b00 = 0;
      uStack_1af8 = 0;
      local_1cc0 = 0x3f8000003f800000;
      uStack_1cb8 = 0x3f8000003f800000;
      local_1b10._0_8_ = auVar7._0_8_;
      local_70 = local_1b10._0_8_;
      local_1b10._8_8_ = auVar7._8_8_;
      uStack_68 = local_1b10._8_8_;
      local_80 = 0x42b0c0a542b0c0a5;
      uStack_78 = 0x42b0c0a542b0c0a5;
      auVar89._8_8_ = 0x42b0c0a542b0c0a5;
      auVar89._0_8_ = 0x42b0c0a542b0c0a5;
      auVar7 = vminps_avx(auVar7,auVar89);
      local_1b10._0_8_ = auVar7._0_8_;
      local_760 = local_1b10._0_8_;
      local_1b10._8_8_ = auVar7._8_8_;
      uStack_758 = local_1b10._8_8_;
      local_770 = 0xc2b0c0a5c2b0c0a5;
      uStack_768 = 0xc2b0c0a5c2b0c0a5;
      auVar65._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar65._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar5 = vmaxps_avx(auVar7,auVar65);
      local_1b10._0_8_ = auVar5._0_8_;
      uVar9 = local_1b10._0_8_;
      local_1b10._8_8_ = auVar5._8_8_;
      uVar10 = local_1b10._8_8_;
      local_660 = 0x3fb8aa3b3fb8aa3b;
      uStack_658 = 0x3fb8aa3b3fb8aa3b;
      local_650._0_4_ = auVar5._0_4_;
      local_650._4_4_ = auVar5._4_4_;
      uStack_648._0_4_ = auVar5._8_4_;
      uStack_648._4_4_ = auVar5._12_4_;
      local_1b30._4_4_ = local_650._4_4_ * 1.442695;
      local_1b30._0_4_ = (float)local_650 * 1.442695;
      uStack_1b28._0_4_ = (float)uStack_648 * 1.442695;
      uStack_1b28._4_4_ = uStack_648._4_4_ * 1.442695;
      local_1a80 = local_1b30;
      uStack_1a78 = uStack_1b28;
      local_1a90 = 0x3f0000003f000000;
      uStack_1a88 = 0x3f0000003f000000;
      local_1b30._0_4_ = (float)local_650 * 1.442695 + 0.5;
      local_1b30._4_4_ = local_650._4_4_ * 1.442695 + 0.5;
      fVar98 = (float)uStack_648 * 1.442695 + 0.5;
      fVar99 = uStack_648._4_4_ * 1.442695 + 0.5;
      uStack_1b28._0_4_ = fVar98;
      uStack_1b28._4_4_ = fVar99;
      local_50 = local_1b30;
      uStack_48 = uStack_1b28;
      local_1b40._4_4_ = (int)(float)local_1b30._4_4_;
      local_1b40._0_4_ = (int)(float)local_1b30._0_4_;
      local_1b40._8_4_ = (int)fVar98;
      local_1b40._12_4_ = (int)fVar99;
      local_6e0 = local_1b40._0_8_;
      uStack_6d8 = local_1b40._8_8_;
      auVar69._8_8_ = local_1b40._8_8_;
      auVar69._0_8_ = local_1b40._0_8_;
      auVar3 = vcvtdq2ps_avx(auVar69);
      local_1b20 = auVar3._0_8_;
      local_1ae0 = local_1b20;
      uStack_1b18 = auVar3._8_8_;
      uStack_1ad8 = uStack_1b18;
      local_1af0 = local_1b30;
      uStack_1ae8 = uStack_1b28;
      auVar30._8_8_ = uStack_1b28;
      auVar30._0_8_ = local_1b30;
      auVar7 = vcmpps_avx(auVar30,auVar3,1);
      local_1b60._0_8_ = auVar7._0_8_;
      local_1ac0 = local_1b60._0_8_;
      local_1b60._8_8_ = auVar7._8_8_;
      uStack_1ab8 = local_1b60._8_8_;
      local_1ad0 = 0x3f8000003f800000;
      uStack_1ac8 = 0x3f8000003f800000;
      auVar31._8_8_ = 0x3f8000003f800000;
      auVar31._0_8_ = 0x3f8000003f800000;
      local_1b60 = vpand_avx(auVar7,auVar31);
      local_1a60 = local_1b20;
      uStack_1a58 = uStack_1b18;
      local_1a70 = local_1b60._0_8_;
      uStack_1a68 = local_1b60._8_8_;
      _local_1b30 = vsubps_avx(auVar3,local_1b60);
      local_448 = local_1b30;
      local_438 = ::_ps_cephes_exp_C1;
      local_5d8 = local_1b10;
      local_c0 = local_1b30;
      uStack_b8 = uStack_1b28;
      local_d0[0] = 0.6933594;
      local_d0[1] = 0.6933594;
      afStack_c8[0] = 0.6933594;
      afStack_c8[1] = 0.6933594;
      local_e0 = local_1b10._0_8_;
      uStack_d8 = local_1b10._8_8_;
      auVar87._8_4_ = 0.6933594;
      auVar87._12_4_ = 0.6933594;
      auVar87._0_4_ = 0.6933594;
      auVar87._4_4_ = 0.6933594;
      auVar7 = vfnmadd213ps_fma(auVar87,_local_1b30,auVar5);
      local_450 = ::_ps_cephes_exp_C2;
      local_90 = local_1b30;
      uStack_88 = uStack_1b28;
      local_a0[0] = -0.00021219444;
      local_a0[1] = -0.00021219444;
      afStack_98[0] = -0.00021219444;
      afStack_98[1] = -0.00021219444;
      local_1b10._0_8_ = auVar7._0_8_;
      local_b0 = local_1b10._0_8_;
      local_1b10._8_8_ = auVar7._8_8_;
      uStack_a8 = local_1b10._8_8_;
      auVar88._8_4_ = -0.00021219444;
      auVar88._12_4_ = -0.00021219444;
      auVar88._0_4_ = -0.00021219444;
      auVar88._4_4_ = -0.00021219444;
      local_1b10 = vfnmadd213ps_fma(auVar88,_local_1b30,auVar7);
      local_680 = local_1b10._0_8_;
      uStack_678 = local_1b10._8_8_;
      local_670._0_4_ = local_1b10._0_4_;
      local_670._4_4_ = local_1b10._4_4_;
      uStack_668._0_4_ = local_1b10._8_4_;
      uStack_668._4_4_ = local_1b10._12_4_;
      local_1b20._4_4_ = local_670._4_4_ * local_670._4_4_;
      local_1b20._0_4_ = (float)local_670 * (float)local_670;
      uStack_1b18._0_4_ = (float)uStack_668 * (float)uStack_668;
      uStack_1b18._4_4_ = uStack_668._4_4_ * uStack_668._4_4_;
      uStack_1b68 = 0x3950696739506967;
      local_1b70 = (undefined1  [8])0x3950696739506967;
      local_5c8 = local_1b70;
      local_560 = ::_ps_cephes_exp_p1;
      local_210 = 0x3950696739506967;
      uStack_208 = 0x3950696739506967;
      local_220 = local_1b10._0_8_;
      uStack_218 = local_1b10._8_8_;
      local_230[0] = 0.0013981999;
      local_230[1] = 0.0013981999;
      afStack_228[0] = 0.0013981999;
      afStack_228[1] = 0.0013981999;
      auVar81._8_4_ = 0.0013981999;
      auVar81._12_4_ = 0.0013981999;
      auVar81._0_4_ = 0.0013981999;
      auVar81._4_4_ = 0.0013981999;
      auVar7 = vfmadd213ps_fma(local_1b10,_local_1b70,auVar81);
      local_578 = ::_ps_cephes_exp_p2;
      local_1b70 = auVar7._0_8_;
      local_1e0 = local_1b70;
      uStack_1b68 = auVar7._8_8_;
      uStack_1d8 = uStack_1b68;
      local_1f0 = local_1b10._0_8_;
      uStack_1e8 = local_1b10._8_8_;
      local_200[0] = 0.008333452;
      local_200[1] = 0.008333452;
      afStack_1f8[0] = 0.008333452;
      afStack_1f8[1] = 0.008333452;
      auVar82._8_4_ = 0.008333452;
      auVar82._12_4_ = 0.008333452;
      auVar82._0_4_ = 0.008333452;
      auVar82._4_4_ = 0.008333452;
      auVar7 = vfmadd213ps_fma(local_1b10,auVar7,auVar82);
      local_590 = ::_ps_cephes_exp_p3;
      local_1b70 = auVar7._0_8_;
      local_1b0 = local_1b70;
      uStack_1b68 = auVar7._8_8_;
      uStack_1a8 = uStack_1b68;
      local_1c0 = local_1b10._0_8_;
      uStack_1b8 = local_1b10._8_8_;
      local_1d0[0] = 0.041665796;
      local_1d0[1] = 0.041665796;
      afStack_1c8[0] = 0.041665796;
      afStack_1c8[1] = 0.041665796;
      auVar83._8_4_ = 0.041665796;
      auVar83._12_4_ = 0.041665796;
      auVar83._0_4_ = 0.041665796;
      auVar83._4_4_ = 0.041665796;
      auVar7 = vfmadd213ps_fma(local_1b10,auVar7,auVar83);
      local_5a8 = ::_ps_cephes_exp_p4;
      local_1b70 = auVar7._0_8_;
      local_180 = local_1b70;
      uStack_1b68 = auVar7._8_8_;
      uStack_178 = uStack_1b68;
      local_190 = local_1b10._0_8_;
      uStack_188 = local_1b10._8_8_;
      local_1a0[0] = 0.16666666;
      local_1a0[1] = 0.16666666;
      afStack_198[0] = 0.16666666;
      afStack_198[1] = 0.16666666;
      auVar84._8_4_ = 0.16666666;
      auVar84._12_4_ = 0.16666666;
      auVar84._0_4_ = 0.16666666;
      auVar84._4_4_ = 0.16666666;
      auVar7 = vfmadd213ps_fma(local_1b10,auVar7,auVar84);
      local_5c0 = ::_ps_cephes_exp_p5;
      local_1b70 = auVar7._0_8_;
      local_150 = local_1b70;
      uStack_1b68 = auVar7._8_8_;
      uStack_148 = uStack_1b68;
      local_160 = local_1b10._0_8_;
      uStack_158 = local_1b10._8_8_;
      local_170[0] = 0.5;
      local_170[1] = 0.5;
      afStack_168[0] = 0.5;
      afStack_168[1] = 0.5;
      auVar85._8_4_ = 0.5;
      auVar85._12_4_ = 0.5;
      auVar85._0_4_ = 0.5;
      auVar85._4_4_ = 0.5;
      auVar7 = vfmadd213ps_fma(local_1b10,auVar7,auVar85);
      local_5d0 = local_1b20;
      local_1b70 = auVar7._0_8_;
      local_120 = local_1b70;
      uStack_1b68 = auVar7._8_8_;
      uStack_118 = uStack_1b68;
      local_130 = local_1b20;
      uStack_128 = uStack_1b18;
      local_140 = local_1b10._0_8_;
      uStack_138 = local_1b10._8_8_;
      auVar7 = vfmadd213ps_fma(_local_1b20,auVar7,local_1b10);
      local_1b70 = auVar7._0_8_;
      uVar11 = local_1b70;
      uStack_1b68 = auVar7._8_8_;
      uVar12 = uStack_1b68;
      local_1ab0 = 0x3f8000003f800000;
      uStack_1aa8 = 0x3f8000003f800000;
      local_1aa0._0_4_ = auVar7._0_4_;
      local_1aa0._4_4_ = auVar7._4_4_;
      uStack_1a98._0_4_ = auVar7._8_4_;
      uStack_1a98._4_4_ = auVar7._12_4_;
      local_1b70._4_4_ = local_1aa0._4_4_ + 1.0;
      local_1b70._0_4_ = (float)local_1aa0 + 1.0;
      uStack_1b68._0_4_ = (float)uStack_1a98 + 1.0;
      uStack_1b68._4_4_ = uStack_1a98._4_4_ + 1.0;
      local_60._0_4_ = local_1b30._0_4_;
      local_60._4_4_ = local_1b30._4_4_;
      uStack_58._0_4_ = local_1b30._8_4_;
      uStack_58._4_4_ = local_1b30._12_4_;
      local_1b40._4_4_ = (int)local_60._4_4_;
      local_1b40._0_4_ = (int)(float)local_60;
      local_1b40._8_4_ = (int)(float)uStack_58;
      local_1b40._12_4_ = (int)uStack_58._4_4_;
      local_800 = local_1b40._0_8_;
      uStack_7f8 = local_1b40._8_8_;
      local_1240 = 0x7f0000007f;
      uStack_1238 = 0x7f0000007f;
      auVar63._8_8_ = local_1b40._8_8_;
      auVar63._0_8_ = local_1b40._0_8_;
      auVar62._8_8_ = 0x7f0000007f;
      auVar62._0_8_ = 0x7f0000007f;
      auVar7 = vpaddd_avx(auVar63,auVar62);
      local_1b40._0_8_ = auVar7._0_8_;
      local_7a0 = local_1b40._0_8_;
      local_1b40._8_8_ = auVar7._8_8_;
      uStack_798 = local_1b40._8_8_;
      local_7a4 = 0x17;
      local_1b40 = vpslld_avx(auVar7,ZEXT416(0x17));
      local_40 = local_1b40._0_8_;
      uStack_38 = local_1b40._8_8_;
      local_1b80 = local_1b40._0_8_;
      uStack_1b78 = local_1b40._8_8_;
      local_690 = local_1b70;
      uStack_688 = uStack_1b68;
      local_6a0 = local_1b40._0_8_;
      uStack_698 = local_1b40._8_8_;
      local_1b70._0_4_ = ((float)local_1aa0 + 1.0) * local_1b40._0_4_;
      local_1b70._4_4_ = (local_1aa0._4_4_ + 1.0) * local_1b40._4_4_;
      fVar98 = ((float)uStack_1a98 + 1.0) * local_1b40._8_4_;
      fVar99 = (uStack_1a98._4_4_ + 1.0) * local_1b40._12_4_;
      uStack_1b68._0_4_ = fVar98;
      uStack_1b68._4_4_ = fVar99;
      local_1ba0 = local_1b70;
      uStack_1b98 = uStack_1b68;
      auVar103._0_8_ = CONCAT44((float)local_1b70._4_4_ + 1.0,(float)local_1b70._0_4_ + 1.0);
      auVar103._8_4_ = fVar98 + 1.0;
      auVar103._12_4_ = fVar99 + 1.0;
      uStack_1c98 = auVar103._8_8_;
      uStack_778 = uStack_1c98;
      local_1c90 = 0;
      uStack_1c88 = 0;
      local_790 = 0;
      uStack_788 = 0;
      auVar64._8_8_ = uStack_1c98;
      auVar64._0_8_ = auVar103._0_8_;
      local_1cd0 = vcmpps_avx(auVar64,ZEXT816(0),2);
      uStack_738 = uStack_1c98;
      local_750 = 0x80000000800000;
      uStack_748 = 0x80000000800000;
      auVar67._8_8_ = uStack_1c98;
      auVar67._0_8_ = auVar103._0_8_;
      auVar66._8_8_ = 0x80000000800000;
      auVar66._0_8_ = 0x80000000800000;
      auVar7 = vmaxps_avx(auVar67,auVar66);
      local_1ca0 = auVar7._0_8_;
      local_730 = local_1ca0;
      uStack_1c98 = auVar7._8_8_;
      uStack_728 = uStack_1c98;
      local_1290 = local_1ca0;
      uStack_1288 = uStack_1c98;
      local_1294 = 0x17;
      auVar5 = vpsrld_avx(auVar7,ZEXT416(0x17));
      local_1c30 = local_1ca0;
      uStack_1c28 = uStack_1c98;
      local_1c40 = 0x807fffff807fffff;
      uStack_1c38 = 0x807fffff807fffff;
      auVar29._8_8_ = 0x807fffff807fffff;
      auVar29._0_8_ = 0x807fffff807fffff;
      auVar7 = vpand_avx(auVar7,auVar29);
      local_1ca0 = auVar7._0_8_;
      local_6f0 = local_1ca0;
      uStack_1c98 = auVar7._8_8_;
      uStack_6e8 = uStack_1c98;
      auVar68._8_8_ = 0x3f0000003f000000;
      auVar68._0_8_ = 0x3f0000003f000000;
      auVar3 = vpor_avx(auVar7,auVar68);
      local_1cb0._0_8_ = auVar5._0_8_;
      local_1230 = local_1cb0._0_8_;
      local_1cb0._8_8_ = auVar5._8_8_;
      uStack_1228 = local_1cb0._8_8_;
      auVar39._8_8_ = 0x7f0000007f;
      auVar39._0_8_ = 0x7f0000007f;
      local_1cb0 = vpsubd_avx(auVar5,auVar39);
      local_6d0 = local_1cb0._0_8_;
      uStack_6c8 = local_1cb0._8_8_;
      auVar7 = vcvtdq2ps_avx(local_1cb0);
      local_1ce0 = auVar7._0_8_;
      uVar13 = local_1ce0;
      uStack_1cd8 = auVar7._8_8_;
      uVar14 = uStack_1cd8;
      local_1be0 = 0x3f8000003f800000;
      uStack_1bd8 = 0x3f8000003f800000;
      local_1bd0._0_4_ = auVar7._0_4_;
      local_1bd0._4_4_ = auVar7._4_4_;
      uStack_1bc8._0_4_ = auVar7._8_4_;
      uStack_1bc8._4_4_ = auVar7._12_4_;
      local_1ce0._4_4_ = local_1bd0._4_4_ + 1.0;
      local_1ce0._0_4_ = (float)local_1bd0 + 1.0;
      uStack_1cd8._0_4_ = (float)uStack_1bc8 + 1.0;
      uStack_1cd8._4_4_ = uStack_1bc8._4_4_ + 1.0;
      local_1ca0 = auVar3._0_8_;
      local_6b0 = local_1ca0;
      uStack_1c98 = auVar3._8_8_;
      uStack_6a8 = uStack_1c98;
      local_6c0 = 0x3f3504f33f3504f3;
      uStack_6b8 = 0x3f3504f33f3504f3;
      auVar70._8_8_ = 0x3f3504f33f3504f3;
      auVar70._0_8_ = 0x3f3504f33f3504f3;
      local_1cf0 = vcmpps_avx(auVar3,auVar70,1);
      local_1c50 = local_1ca0;
      uStack_1c48 = uStack_1c98;
      local_1c60 = local_1cf0._0_8_;
      uStack_1c58 = local_1cf0._8_8_;
      local_1d00 = vpand_avx(auVar3,local_1cf0);
      local_1a20 = local_1ca0;
      uStack_1a18 = uStack_1c98;
      local_1a30 = 0x3f8000003f800000;
      uStack_1a28 = 0x3f8000003f800000;
      auVar33._8_8_ = 0x3f8000003f800000;
      auVar33._0_8_ = 0x3f8000003f800000;
      auVar7 = vsubps_avx(auVar3,auVar33);
      local_1a40 = local_1ce0;
      uStack_1a38 = uStack_1cd8;
      local_1c70 = 0x3f8000003f800000;
      uStack_1c68 = 0x3f8000003f800000;
      local_1c80 = local_1cf0._0_8_;
      uStack_1c78 = local_1cf0._8_8_;
      auVar28._8_8_ = 0x3f8000003f800000;
      auVar28._0_8_ = 0x3f8000003f800000;
      local_1a50 = vpand_avx(auVar28,local_1cf0);
      auVar32._8_8_ = uStack_1cd8;
      auVar32._0_8_ = local_1ce0;
      _local_1ce0 = vsubps_avx(auVar32,local_1a50);
      local_1ca0 = auVar7._0_8_;
      uVar15 = local_1ca0;
      uStack_1c98 = auVar7._8_8_;
      uVar16 = uStack_1c98;
      local_1bf0._0_4_ = auVar7._0_4_;
      local_1bf0._4_4_ = auVar7._4_4_;
      uStack_1be8._0_4_ = auVar7._8_4_;
      uStack_1be8._4_4_ = auVar7._12_4_;
      local_1c00._0_4_ = local_1d00._0_4_;
      local_1c00._4_4_ = local_1d00._4_4_;
      uStack_1bf8._0_4_ = local_1d00._8_4_;
      uStack_1bf8._4_4_ = local_1d00._12_4_;
      local_1ca0._0_4_ = (float)local_1bf0 + (float)local_1c00;
      local_1ca0._4_4_ = local_1bf0._4_4_ + local_1c00._4_4_;
      uStack_1be8._0_4_ = (float)uStack_1be8 + (float)uStack_1bf8;
      uStack_1be8._4_4_ = uStack_1be8._4_4_ + uStack_1bf8._4_4_;
      uStack_1c98._0_4_ = (float)uStack_1be8;
      uStack_1c98._4_4_ = uStack_1be8._4_4_;
      local_600 = local_1ca0;
      uStack_5f8 = uStack_1c98;
      local_1d10 = (float)local_1ca0._0_4_ * (float)local_1ca0._0_4_;
      fStack_1d0c = (float)local_1ca0._4_4_ * (float)local_1ca0._4_4_;
      fStack_1d08 = (float)uStack_1be8 * (float)uStack_1be8;
      fStack_1d04 = uStack_1be8._4_4_ * uStack_1be8._4_4_;
      uStack_1d18 = 0x3d9021bb3d9021bb;
      local_1d20 = (undefined1  [8])0x3d9021bb3d9021bb;
      local_530 = local_1d20;
      local_510 = local_1ca0;
      local_470 = ::_ps_cephes_log_p1;
      local_3f0 = 0x3d9021bb3d9021bb;
      uStack_3e8 = 0x3d9021bb3d9021bb;
      local_400 = local_1ca0;
      uStack_3f8 = uStack_1c98;
      local_410[0] = -0.1151461;
      local_410[1] = -0.1151461;
      afStack_408[0] = -0.1151461;
      afStack_408[1] = -0.1151461;
      auVar71._8_4_ = -0.1151461;
      auVar71._12_4_ = -0.1151461;
      auVar71._0_4_ = -0.1151461;
      auVar71._4_4_ = -0.1151461;
      auVar7 = vfmadd213ps_fma(_local_1ca0,_local_1d20,auVar71);
      local_488 = ::_ps_cephes_log_p2;
      local_1d20 = auVar7._0_8_;
      local_3c0 = local_1d20;
      uStack_1d18 = auVar7._8_8_;
      uStack_3b8 = uStack_1d18;
      local_3d0 = local_1ca0;
      uStack_3c8 = uStack_1c98;
      local_3e0[0] = 0.116769984;
      local_3e0[1] = 0.116769984;
      afStack_3d8[0] = 0.116769984;
      afStack_3d8[1] = 0.116769984;
      auVar72._8_4_ = 0.116769984;
      auVar72._12_4_ = 0.116769984;
      auVar72._0_4_ = 0.116769984;
      auVar72._4_4_ = 0.116769984;
      auVar7 = vfmadd213ps_fma(_local_1ca0,auVar7,auVar72);
      local_4a0 = ::_ps_cephes_log_p3;
      local_1d20 = auVar7._0_8_;
      local_390 = local_1d20;
      uStack_1d18 = auVar7._8_8_;
      uStack_388 = uStack_1d18;
      local_3a0 = local_1ca0;
      uStack_398 = uStack_1c98;
      local_3b0[0] = -0.12420141;
      local_3b0[1] = -0.12420141;
      afStack_3a8[0] = -0.12420141;
      afStack_3a8[1] = -0.12420141;
      auVar73._8_4_ = -0.12420141;
      auVar73._12_4_ = -0.12420141;
      auVar73._0_4_ = -0.12420141;
      auVar73._4_4_ = -0.12420141;
      auVar7 = vfmadd213ps_fma(_local_1ca0,auVar7,auVar73);
      local_4b8 = ::_ps_cephes_log_p4;
      local_1d20 = auVar7._0_8_;
      local_360 = local_1d20;
      uStack_1d18 = auVar7._8_8_;
      uStack_358 = uStack_1d18;
      local_370 = local_1ca0;
      uStack_368 = uStack_1c98;
      local_380[0] = 0.14249323;
      local_380[1] = 0.14249323;
      afStack_378[0] = 0.14249323;
      afStack_378[1] = 0.14249323;
      auVar74._8_4_ = 0.14249323;
      auVar74._12_4_ = 0.14249323;
      auVar74._0_4_ = 0.14249323;
      auVar74._4_4_ = 0.14249323;
      auVar7 = vfmadd213ps_fma(_local_1ca0,auVar7,auVar74);
      local_4d0 = ::_ps_cephes_log_p5;
      local_1d20 = auVar7._0_8_;
      local_330 = local_1d20;
      uStack_1d18 = auVar7._8_8_;
      uStack_328 = uStack_1d18;
      local_340 = local_1ca0;
      uStack_338 = uStack_1c98;
      local_350[0] = -0.16668057;
      local_350[1] = -0.16668057;
      afStack_348[0] = -0.16668057;
      afStack_348[1] = -0.16668057;
      auVar75._8_4_ = -0.16668057;
      auVar75._12_4_ = -0.16668057;
      auVar75._0_4_ = -0.16668057;
      auVar75._4_4_ = -0.16668057;
      auVar7 = vfmadd213ps_fma(_local_1ca0,auVar7,auVar75);
      local_4e8 = ::_ps_cephes_log_p6;
      local_1d20 = auVar7._0_8_;
      local_300 = local_1d20;
      uStack_1d18 = auVar7._8_8_;
      uStack_2f8 = uStack_1d18;
      local_310 = local_1ca0;
      uStack_308 = uStack_1c98;
      local_320[0] = 0.20000714;
      local_320[1] = 0.20000714;
      afStack_318[0] = 0.20000714;
      afStack_318[1] = 0.20000714;
      auVar76._8_4_ = 0.20000714;
      auVar76._12_4_ = 0.20000714;
      auVar76._0_4_ = 0.20000714;
      auVar76._4_4_ = 0.20000714;
      auVar7 = vfmadd213ps_fma(_local_1ca0,auVar7,auVar76);
      local_500 = ::_ps_cephes_log_p7;
      local_1d20 = auVar7._0_8_;
      local_2d0 = local_1d20;
      uStack_1d18 = auVar7._8_8_;
      uStack_2c8 = uStack_1d18;
      local_2e0 = local_1ca0;
      uStack_2d8 = uStack_1c98;
      local_2f0[0] = -0.24999994;
      local_2f0[1] = -0.24999994;
      afStack_2e8[0] = -0.24999994;
      afStack_2e8[1] = -0.24999994;
      auVar77._8_4_ = -0.24999994;
      auVar77._12_4_ = -0.24999994;
      auVar77._0_4_ = -0.24999994;
      auVar77._4_4_ = -0.24999994;
      auVar7 = vfmadd213ps_fma(_local_1ca0,auVar7,auVar77);
      local_518 = ::_ps_cephes_log_p8;
      local_1d20 = auVar7._0_8_;
      local_2a0 = local_1d20;
      uStack_1d18 = auVar7._8_8_;
      uStack_298 = uStack_1d18;
      local_2b0 = local_1ca0;
      uStack_2a8 = uStack_1c98;
      local_2c0[0] = 0.3333333;
      local_2c0[1] = 0.3333333;
      afStack_2b8[0] = 0.3333333;
      afStack_2b8[1] = 0.3333333;
      auVar78._8_4_ = 0.3333333;
      auVar78._12_4_ = 0.3333333;
      auVar78._0_4_ = 0.3333333;
      auVar78._4_4_ = 0.3333333;
      auVar7 = vfmadd213ps_fma(_local_1ca0,auVar7,auVar78);
      local_1d20 = auVar7._0_8_;
      uVar17 = local_1d20;
      uStack_1d18 = auVar7._8_8_;
      uVar18 = uStack_1d18;
      local_620 = local_1ca0;
      uStack_618 = uStack_1c98;
      local_610._0_4_ = auVar7._0_4_;
      local_610._4_4_ = auVar7._4_4_;
      uStack_608._0_4_ = auVar7._8_4_;
      uStack_608._4_4_ = auVar7._12_4_;
      local_1d20._4_4_ = local_610._4_4_ * (float)local_1ca0._4_4_;
      local_1d20._0_4_ = (float)local_610 * (float)local_1ca0._0_4_;
      uStack_1d18._0_4_ = (float)uStack_608 * (float)uStack_1be8;
      uStack_1d18._4_4_ = uStack_608._4_4_ * uStack_1be8._4_4_;
      local_630 = local_1d20;
      uStack_628 = uStack_1d18;
      local_640 = CONCAT44(fStack_1d0c,local_1d10);
      uStack_638 = CONCAT44(fStack_1d04,fStack_1d08);
      local_1d20._4_4_ = local_610._4_4_ * (float)local_1ca0._4_4_ * fStack_1d0c;
      local_1d20._0_4_ = (float)local_610 * (float)local_1ca0._0_4_ * local_1d10;
      uStack_1d18._0_4_ = (float)uStack_608 * (float)uStack_1be8 * fStack_1d08;
      uStack_1d18._4_4_ = uStack_608._4_4_ * uStack_1be8._4_4_ * fStack_1d04;
      local_520 = local_1ce0;
      local_528 = ::_ps_cephes_log_q1;
      local_270 = local_1ce0;
      uStack_268 = uStack_1cd8;
      local_280[0] = -0.00021219444;
      local_280[1] = -0.00021219444;
      afStack_278[0] = -0.00021219444;
      afStack_278[1] = -0.00021219444;
      local_290 = local_1d20;
      uStack_288 = uStack_1d18;
      auVar79._8_4_ = -0.00021219444;
      auVar79._12_4_ = -0.00021219444;
      auVar79._0_4_ = -0.00021219444;
      auVar79._4_4_ = -0.00021219444;
      auVar7 = vfmadd213ps_fma(auVar79,_local_1ce0,_local_1d20);
      local_418 = &local_1d10;
      local_420 = ::_ps_0p5;
      local_f0 = CONCAT44(fStack_1d0c,local_1d10);
      uStack_e8 = CONCAT44(fStack_1d04,fStack_1d08);
      auVar90._4_4_ = fStack_1d0c;
      auVar90._0_4_ = local_1d10;
      auVar90._8_4_ = fStack_1d08;
      auVar90._12_4_ = fStack_1d04;
      local_100[0] = 0.5;
      local_100[1] = 0.5;
      afStack_f8[0] = 0.5;
      afStack_f8[1] = 0.5;
      local_1d20 = auVar7._0_8_;
      local_110 = local_1d20;
      uStack_1d18 = auVar7._8_8_;
      uStack_108 = uStack_1d18;
      auVar86._8_4_ = 0.5;
      auVar86._12_4_ = 0.5;
      auVar86._0_4_ = 0.5;
      auVar86._4_4_ = 0.5;
      _local_1d20 = vfmadd213ps_fma(auVar86,auVar90 ^ _DAT_01f94300,auVar7);
      local_1c10 = local_1ca0;
      uStack_1c08 = uStack_1c98;
      local_1c20._0_4_ = local_1d20._0_4_;
      local_1c20._4_4_ = local_1d20._4_4_;
      uStack_1c18._0_4_ = local_1d20._8_4_;
      uStack_1c18._4_4_ = local_1d20._12_4_;
      local_1ca0._4_4_ = (float)local_1ca0._4_4_ + local_1c20._4_4_;
      local_1ca0._0_4_ = (float)local_1ca0._0_4_ + (float)local_1c20;
      uStack_1c98._0_4_ = (float)uStack_1be8 + (float)uStack_1c18;
      uStack_1c98._4_4_ = uStack_1be8._4_4_ + uStack_1c18._4_4_;
      local_538 = local_1ce0;
      local_540 = ::_ps_cephes_log_q2;
      local_548 = local_1ca0;
      local_240 = local_1ce0;
      uStack_238 = uStack_1cd8;
      local_250[0] = 0.6933594;
      local_250[1] = 0.6933594;
      afStack_248[0] = 0.6933594;
      afStack_248[1] = 0.6933594;
      local_260 = local_1ca0;
      uStack_258 = uStack_1c98;
      auVar80._8_4_ = 0.6933594;
      auVar80._12_4_ = 0.6933594;
      auVar80._0_4_ = 0.6933594;
      auVar80._4_4_ = 0.6933594;
      auVar7 = vfmadd213ps_fma(auVar80,_local_1ce0,_local_1ca0);
      local_1ca0 = auVar7._0_8_;
      local_710 = local_1ca0;
      uStack_1c98 = auVar7._8_8_;
      uStack_708 = uStack_1c98;
      local_720 = local_1cd0._0_8_;
      uStack_718 = local_1cd0._8_8_;
      _local_1ca0 = vpor_avx(auVar7,local_1cd0);
      local_26c0 = auVar4._0_8_;
      local_1d60 = local_26c0;
      uStack_26b8 = auVar4._8_8_;
      uStack_1d58 = uStack_26b8;
      auVar4 = vpand_avx(*(undefined1 (*) [16])*local_2540,auVar4);
      local_26f0 = auVar4._0_8_;
      uStack_26e8 = auVar4._8_8_;
      local_1bb0._0_4_ = auVar4._0_4_;
      local_1bb0._4_4_ = auVar4._4_4_;
      uStack_1ba8._0_4_ = auVar4._8_4_;
      uStack_1ba8._4_4_ = auVar4._12_4_;
      local_1bc0._0_4_ = local_1ca0._0_4_;
      local_1bc0._4_4_ = local_1ca0._4_4_;
      uStack_1bb8._0_4_ = local_1ca0._8_4_;
      uStack_1bb8._4_4_ = local_1ca0._12_4_;
      local_26b0 = CONCAT44(local_1bb0._4_4_ + local_1bc0._4_4_,
                            (float)local_1bb0 + (float)local_1bc0);
      uStack_26a8 = CONCAT44(uStack_1ba8._4_4_ + uStack_1bb8._4_4_,
                             (float)uStack_1ba8 + (float)uStack_1bb8);
      local_19d8 = local_2540;
      local_19f0 = local_26b0;
      uStack_19e8 = uStack_26a8;
      *(undefined8 *)*local_2540 = local_26b0;
      *(undefined8 *)(*local_2540 + 8) = uStack_26a8;
      local_2540 = (undefined1 (*) [32])(*local_2540 + 0x10);
      local_1d50 = local_1d70;
      uStack_1d48 = uStack_1d68;
      local_1d30 = local_1d70;
      uStack_1d28 = uStack_1d68;
      local_1c20 = local_1d20;
      uStack_1c18 = uStack_1d18;
      local_1c00 = local_1d00._0_8_;
      uStack_1bf8 = local_1d00._8_8_;
      local_1bf0 = uVar15;
      uStack_1be8 = uVar16;
      local_1bd0 = uVar13;
      uStack_1bc8 = uVar14;
      local_1bc0 = local_1ca0;
      uStack_1bb8 = uStack_1c98;
      local_1bb0 = local_26f0;
      uStack_1ba8 = uStack_26e8;
      local_1b90 = 0x3f8000003f800000;
      uStack_1b88 = 0x3f8000003f800000;
      local_1b50 = local_1cc0;
      uStack_1b48 = uStack_1cb8;
      local_1aa0 = uVar11;
      uStack_1a98 = uVar12;
      local_810 = local_1240;
      uStack_808 = uStack_1238;
      local_780 = auVar103._0_8_;
      local_740 = auVar103._0_8_;
      local_700 = local_1a90;
      uStack_6f8 = uStack_1a88;
      local_670 = local_680;
      uStack_668 = uStack_678;
      local_650 = uVar9;
      uStack_648 = uVar10;
      local_610 = uVar17;
      uStack_608 = uVar18;
      local_5f0 = local_600;
      uStack_5e8 = uStack_5f8;
      local_5b8 = local_5d8;
      local_5b0 = local_5c8;
      local_5a0 = local_5d8;
      local_598 = local_5c8;
      local_588 = local_5d8;
      local_580 = local_5c8;
      local_570 = local_5d8;
      local_568 = local_5c8;
      local_558 = local_5d8;
      local_550 = local_5c8;
      local_508 = local_530;
      local_4f8 = local_510;
      local_4f0 = local_530;
      local_4e0 = local_510;
      local_4d8 = local_530;
      local_4c8 = local_510;
      local_4c0 = local_530;
      local_4b0 = local_510;
      local_4a8 = local_530;
      local_498 = local_510;
      local_490 = local_530;
      local_480 = local_510;
      local_478 = local_530;
      local_468 = local_510;
      local_460 = local_530;
      local_458 = local_5d8;
      local_440 = local_5d8;
      local_430 = local_448;
      local_428 = local_530;
      local_60 = local_1b30;
      uStack_58 = uStack_1b28;
    }
    for (; local_1da0 = auVar4, local_2598 < local_2530; local_2598 = local_2598 + 1) {
      if (*(float *)*local_2540 <= 0.0) {
        fVar98 = expf(*(float *)*local_2540);
        fVar98 = logf(fVar98 + 1.0);
        *(float *)*local_2540 = fVar98;
      }
      else {
        fVar98 = *(float *)*local_2540;
        fVar99 = expf(-*(float *)*local_2540);
        fVar99 = logf(fVar99 + 1.0);
        *(float *)*local_2540 = fVar98 + fVar99;
      }
      local_2540 = (undefined1 (*) [32])(*local_2540 + 4);
      auVar4 = local_1da0;
    }
  }
  return 0;
}

Assistant:

int BNLL_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __mmask16 mask = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_GT_OQ);
            __m512 _abs_p = _mm512_castsi512_ps(_mm512_and_epi32(_mm512_castps_si512(_p), _mm512_set1_epi32(0x7fffffff)));
            __m512 _tmp = log512_ps(_mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _abs_p))));
            _p = _mm512_mask_add_ps(_tmp, mask, _tmp, _p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 mask = _mm256_cmp_ps(_p, _mm256_setzero_ps(), _CMP_GT_OQ);
            __m256 _abs_p = _mm256_and_ps(_p, *(__m256*)_ps256_inv_sign_mask);
            __m256 _tmp = log256_ps(_mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _abs_p))));
            __m256 _x = _mm256_and_ps(_p, mask);
            _p = _mm256_add_ps(_x, _tmp);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 mask = _mm_cmpgt_ps(_p, _zero);
            __m128 _abs_p = _mm_and_ps(_p, *(__m128*)_ps_inv_sign_mask);
            __m128 _tmp = log_ps(_mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _abs_p))));
            __m128 _x = _mm_and_ps(_p, mask);
            _p = _mm_add_ps(_x, _tmp);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr > 0)
                *ptr = *ptr + logf(1.f + expf(-(*ptr)));
            else
                *ptr = logf(1.f + expf(*ptr));
            ptr++;
        }
    }
    return 0;
}